

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::QuadMiMBIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RayK<8> *pRVar1;
  uint uVar2;
  BBox1f BVar3;
  float fVar4;
  Geometry *pGVar5;
  long lVar6;
  long lVar7;
  RTCRayQueryContext *pRVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [32];
  ulong uVar18;
  ulong uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  size_t k;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  RTCHitN *pRVar67;
  uint uVar68;
  byte bVar69;
  int iVar70;
  AABBNodeMB4D *node1;
  ulong uVar71;
  ulong uVar72;
  byte bVar73;
  long lVar74;
  undefined1 (*pauVar75) [32];
  byte bVar76;
  ulong uVar77;
  vuint<4> *v;
  ulong *puVar78;
  NodeRef root;
  bool bVar79;
  ulong uVar80;
  ulong uVar81;
  undefined1 auVar82 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar83 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar84 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  float fVar113;
  float fVar114;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar115 [32];
  float fVar121;
  float fVar124;
  float fVar125;
  undefined1 auVar122 [16];
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar123 [32];
  undefined1 auVar130 [36];
  undefined1 extraout_var [36];
  undefined1 extraout_var_00 [36];
  undefined1 auVar132 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar133 [36];
  undefined1 auVar134 [36];
  undefined1 auVar135 [32];
  RTCHitN aRVar136 [32];
  float fVar137;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar138 [64];
  float fVar145;
  float fVar152;
  undefined1 auVar147 [32];
  undefined1 auVar146 [16];
  float fVar150;
  float fVar151;
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 auVar149 [64];
  float fVar156;
  undefined1 auVar157 [16];
  float fVar163;
  undefined1 auVar158 [32];
  float fVar161;
  float fVar162;
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar160 [64];
  float fVar167;
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  undefined1 auVar172 [64];
  undefined1 auVar179 [28];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [64];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [28];
  undefined1 auVar186 [64];
  undefined1 in_ZMM10 [64];
  undefined4 uVar187;
  undefined1 in_ZMM11 [64];
  undefined1 auVar188 [16];
  undefined1 in_ZMM12 [64];
  uint uVar189;
  uint uVar192;
  uint uVar193;
  uint uVar194;
  undefined1 in_ZMM13 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 in_ZMM14 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [28];
  undefined1 auVar198 [64];
  undefined1 in_ZMM20 [64];
  RTCHitN aRVar199 [32];
  undefined1 in_ZMM21 [64];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  undefined1 auVar202 [64];
  undefined1 auVar203 [64];
  undefined1 in_ZMM27 [64];
  undefined1 auVar204 [64];
  undefined1 auVar205 [64];
  vuint<4> *v_1;
  QuadMesh *mesh;
  Precalculations pre;
  vint<8> itime;
  Vec3<embree::vfloat_impl<8>_> p1;
  Vec3<embree::vfloat_impl<8>_> p0;
  TravRayK<8,_false> tray;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  byte local_5dbc;
  Precalculations local_5d81;
  ulong local_5d80;
  ulong local_5d78;
  RayK<8> *local_5d70;
  undefined4 local_5d64;
  undefined1 local_5d60 [32];
  undefined1 local_5d40 [32];
  undefined8 local_5d20;
  float fStack_5d18;
  float fStack_5d14;
  float fStack_5d10;
  float fStack_5d0c;
  float fStack_5d08;
  undefined4 uStack_5d04;
  float local_5d00 [4];
  float fStack_5cf0;
  float fStack_5cec;
  float fStack_5ce8;
  undefined4 uStack_5ce4;
  undefined1 (*local_5cc8) [32];
  undefined1 local_5cc0 [32];
  BVH *local_5ca0;
  Intersectors *local_5c98;
  ulong local_5c90;
  ulong local_5c88;
  undefined1 local_5c80 [32];
  undefined1 local_5c60 [32];
  undefined1 local_5c40 [32];
  undefined1 local_5c20 [32];
  undefined1 local_5c00 [32];
  undefined1 local_5be0 [32];
  undefined1 local_5bc0 [32];
  undefined1 local_5ba0 [32];
  RTCHitN local_5b80 [32];
  undefined1 local_5b60 [8];
  float fStack_5b58;
  float fStack_5b54;
  float fStack_5b50;
  float fStack_5b4c;
  float fStack_5b48;
  undefined1 local_5b40 [8];
  float fStack_5b38;
  float fStack_5b34;
  float fStack_5b30;
  float fStack_5b2c;
  float fStack_5b28;
  undefined1 local_5b20 [32];
  undefined1 local_5b00 [32];
  undefined1 local_5ae0 [32];
  undefined1 local_5ac0 [32];
  uint local_5aa0;
  uint uStack_5a9c;
  uint uStack_5a98;
  uint uStack_5a94;
  uint uStack_5a90;
  uint uStack_5a8c;
  uint uStack_5a88;
  uint uStack_5a84;
  uint local_5a80;
  uint uStack_5a7c;
  uint uStack_5a78;
  uint uStack_5a74;
  uint uStack_5a70;
  uint uStack_5a6c;
  uint uStack_5a68;
  uint uStack_5a64;
  float local_5a60;
  float fStack_5a5c;
  float fStack_5a58;
  float fStack_5a54;
  float fStack_5a50;
  float fStack_5a4c;
  float fStack_5a48;
  int iStack_5a44;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5a40;
  undefined1 local_59e0 [32];
  undefined1 local_59c0 [32];
  undefined1 local_59a0 [32];
  undefined1 local_5980 [32];
  undefined1 local_5960 [32];
  undefined1 local_5940 [32];
  float local_5920;
  float fStack_591c;
  float fStack_5918;
  float fStack_5914;
  float fStack_5910;
  float fStack_590c;
  float fStack_5908;
  undefined4 uStack_5904;
  float local_5900;
  float fStack_58fc;
  float fStack_58f8;
  float fStack_58f4;
  float fStack_58f0;
  float fStack_58ec;
  float fStack_58e8;
  undefined4 uStack_58e4;
  undefined1 local_58e0 [32];
  int local_58c0;
  int iStack_58bc;
  int iStack_58b8;
  int iStack_58b4;
  int iStack_58b0;
  int iStack_58ac;
  int iStack_58a8;
  int iStack_58a4;
  uint local_58a0;
  uint uStack_589c;
  uint uStack_5898;
  uint uStack_5894;
  uint uStack_5890;
  uint uStack_588c;
  uint uStack_5888;
  uint uStack_5884;
  uint local_5880;
  uint uStack_587c;
  uint uStack_5878;
  uint uStack_5874;
  uint uStack_5870;
  uint uStack_586c;
  uint uStack_5868;
  uint uStack_5864;
  undefined1 local_5860 [32];
  undefined1 local_5840 [32];
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  undefined1 auVar131 [36];
  undefined1 auVar148 [32];
  undefined1 auVar159 [32];
  
  local_5808 = (((BVH *)This->ptr)->root).ptr;
  if (local_5808 != 8) {
    auVar85 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
    auVar82 = ZEXT816(0) << 0x40;
    uVar80 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar82),5);
    uVar72 = vpcmpeqd_avx512vl(auVar85,(undefined1  [32])valid_i->field_0);
    uVar80 = uVar80 & uVar72;
    local_5dbc = (byte)uVar80;
    if (local_5dbc != 0) {
      local_5ca0 = (BVH *)This->ptr;
      local_5c98 = This;
      local_5a40._0_4_ = *(float *)ray;
      local_5a40._4_4_ = *(float *)(ray + 4);
      local_5a40._8_4_ = *(float *)(ray + 8);
      local_5a40._12_4_ = *(float *)(ray + 0xc);
      local_5a40._16_4_ = *(float *)(ray + 0x10);
      local_5a40._20_4_ = *(float *)(ray + 0x14);
      local_5a40._24_4_ = *(float *)(ray + 0x18);
      local_5a40._28_4_ = *(undefined4 *)(ray + 0x1c);
      local_5a40._32_4_ = *(float *)(ray + 0x20);
      local_5a40._36_4_ = *(float *)(ray + 0x24);
      local_5a40._40_4_ = *(float *)(ray + 0x28);
      local_5a40._44_4_ = *(float *)(ray + 0x2c);
      local_5a40._48_4_ = *(float *)(ray + 0x30);
      local_5a40._52_4_ = *(float *)(ray + 0x34);
      local_5a40._56_4_ = *(float *)(ray + 0x38);
      local_5a40._60_4_ = *(undefined4 *)(ray + 0x3c);
      local_5a40._64_4_ = *(float *)(ray + 0x40);
      local_5a40._68_4_ = *(float *)(ray + 0x44);
      local_5a40._72_4_ = *(float *)(ray + 0x48);
      local_5a40._76_4_ = *(float *)(ray + 0x4c);
      local_5a40._80_4_ = *(float *)(ray + 0x50);
      local_5a40._84_4_ = *(float *)(ray + 0x54);
      local_5a40._88_4_ = *(float *)(ray + 0x58);
      local_5a40._92_4_ = *(undefined4 *)(ray + 0x5c);
      local_59e0 = *(undefined1 (*) [32])(ray + 0x80);
      local_59c0 = *(undefined1 (*) [32])(ray + 0xa0);
      local_59a0 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar200 = ZEXT3264(auVar85);
      vandps_avx512vl(local_59e0,auVar85);
      auVar86._8_4_ = 0x219392ef;
      auVar86._0_8_ = 0x219392ef219392ef;
      auVar86._12_4_ = 0x219392ef;
      auVar86._16_4_ = 0x219392ef;
      auVar86._20_4_ = 0x219392ef;
      auVar86._24_4_ = 0x219392ef;
      auVar86._28_4_ = 0x219392ef;
      auVar186 = ZEXT3264(auVar86);
      uVar72 = vcmpps_avx512vl(auVar85,auVar86,1);
      bVar79 = (bool)((byte)uVar72 & 1);
      auVar88._0_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_59e0._0_4_;
      bVar79 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar88._4_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_59e0._4_4_;
      bVar79 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar88._8_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_59e0._8_4_;
      bVar79 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar88._12_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_59e0._12_4_;
      bVar79 = (bool)((byte)(uVar72 >> 4) & 1);
      auVar88._16_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_59e0._16_4_;
      bVar79 = (bool)((byte)(uVar72 >> 5) & 1);
      auVar88._20_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_59e0._20_4_;
      bVar79 = (bool)((byte)(uVar72 >> 6) & 1);
      auVar88._24_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_59e0._24_4_;
      bVar79 = SUB81(uVar72 >> 7,0);
      auVar88._28_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_59e0._28_4_;
      vandps_avx512vl(local_59c0,auVar85);
      uVar72 = vcmpps_avx512vl(auVar88,auVar86,1);
      bVar79 = (bool)((byte)uVar72 & 1);
      auVar89._0_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_59c0._0_4_;
      bVar79 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar89._4_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_59c0._4_4_;
      bVar79 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar89._8_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_59c0._8_4_;
      bVar79 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar89._12_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_59c0._12_4_;
      bVar79 = (bool)((byte)(uVar72 >> 4) & 1);
      auVar89._16_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_59c0._16_4_;
      bVar79 = (bool)((byte)(uVar72 >> 5) & 1);
      auVar89._20_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_59c0._20_4_;
      bVar79 = (bool)((byte)(uVar72 >> 6) & 1);
      auVar89._24_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_59c0._24_4_;
      bVar79 = SUB81(uVar72 >> 7,0);
      auVar89._28_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_59c0._28_4_;
      vandps_avx512vl(local_59a0,auVar85);
      uVar72 = vcmpps_avx512vl(auVar89,auVar86,1);
      bVar79 = (bool)((byte)uVar72 & 1);
      auVar85._0_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_59a0._0_4_;
      bVar79 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar85._4_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_59a0._4_4_;
      bVar79 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar85._8_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_59a0._8_4_;
      bVar79 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar85._12_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_59a0._12_4_;
      bVar79 = (bool)((byte)(uVar72 >> 4) & 1);
      auVar85._16_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_59a0._16_4_;
      bVar79 = (bool)((byte)(uVar72 >> 5) & 1);
      auVar85._20_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_59a0._20_4_;
      bVar79 = (bool)((byte)(uVar72 >> 6) & 1);
      auVar85._24_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_59a0._24_4_;
      bVar79 = SUB81(uVar72 >> 7,0);
      auVar85._28_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_59a0._28_4_;
      auVar86 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar201 = ZEXT3264(auVar86);
      auVar87 = vrcp14ps_avx512vl(auVar88);
      auVar88 = vfnmadd213ps_avx512vl(auVar88,auVar87,auVar86);
      auVar84 = vfmadd132ps_fma(auVar88,auVar87,auVar87);
      auVar149 = ZEXT1664(auVar84);
      auVar88 = vrcp14ps_avx512vl(auVar89);
      auVar89 = vfnmadd213ps_avx512vl(auVar89,auVar88,auVar86);
      auVar83 = vfmadd132ps_fma(auVar89,auVar88,auVar88);
      auVar160 = ZEXT1664(auVar83);
      auVar88 = vrcp14ps_avx512vl(auVar85);
      auVar182 = ZEXT3264(auVar88);
      auVar85 = vfnmadd213ps_avx512vl(auVar85,auVar88,auVar86);
      local_5980 = ZEXT1632(auVar84);
      local_5960 = ZEXT1632(auVar83);
      auVar122 = vfmadd132ps_fma(auVar85,auVar88,auVar88);
      auVar172 = ZEXT1664(auVar122);
      local_5940 = ZEXT1632(auVar122);
      local_58e0._4_4_ = *(float *)(ray + 0x44) * auVar122._4_4_;
      local_58e0._0_4_ = *(float *)(ray + 0x40) * auVar122._0_4_;
      local_58e0._8_4_ = *(float *)(ray + 0x48) * auVar122._8_4_;
      local_58e0._12_4_ = *(float *)(ray + 0x4c) * auVar122._12_4_;
      local_58e0._16_4_ = *(float *)(ray + 0x50) * 0.0;
      local_58e0._20_4_ = *(float *)(ray + 0x54) * 0.0;
      local_58e0._24_4_ = *(float *)(ray + 0x58) * 0.0;
      local_58e0._28_4_ = *(undefined4 *)(ray + 0x5c);
      auVar138 = ZEXT3264(local_58e0);
      local_5920 = *(float *)ray * auVar84._0_4_;
      fStack_591c = *(float *)(ray + 4) * auVar84._4_4_;
      fStack_5918 = *(float *)(ray + 8) * auVar84._8_4_;
      fStack_5914 = *(float *)(ray + 0xc) * auVar84._12_4_;
      fStack_5910 = *(float *)(ray + 0x10) * 0.0;
      fStack_590c = *(float *)(ray + 0x14) * 0.0;
      fStack_5908 = *(float *)(ray + 0x18) * 0.0;
      uStack_5904 = *(undefined4 *)(ray + 0x1c);
      local_5900 = *(float *)(ray + 0x20) * auVar83._0_4_;
      fStack_58fc = *(float *)(ray + 0x24) * auVar83._4_4_;
      fStack_58f8 = *(float *)(ray + 0x28) * auVar83._8_4_;
      fStack_58f4 = *(float *)(ray + 0x2c) * auVar83._12_4_;
      fStack_58f0 = *(float *)(ray + 0x30) * 0.0;
      fStack_58ec = *(float *)(ray + 0x34) * 0.0;
      fStack_58e8 = *(float *)(ray + 0x38) * 0.0;
      uStack_58e4 = *(undefined4 *)(ray + 0x3c);
      uVar72 = vcmpps_avx512vl(ZEXT1632(auVar84),ZEXT1632(auVar82),1);
      auVar85 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      local_58c0 = (uint)((byte)uVar72 & 1) * auVar85._0_4_;
      iStack_58bc = (uint)((byte)(uVar72 >> 1) & 1) * auVar85._4_4_;
      iStack_58b8 = (uint)((byte)(uVar72 >> 2) & 1) * auVar85._8_4_;
      iStack_58b4 = (uint)((byte)(uVar72 >> 3) & 1) * auVar85._12_4_;
      iStack_58b0 = (uint)((byte)(uVar72 >> 4) & 1) * auVar85._16_4_;
      iStack_58ac = (uint)((byte)(uVar72 >> 5) & 1) * auVar85._20_4_;
      iStack_58a8 = (uint)((byte)(uVar72 >> 6) & 1) * auVar85._24_4_;
      iStack_58a4 = (uint)(byte)(uVar72 >> 7) * auVar85._28_4_;
      auVar88 = ZEXT1632(auVar82);
      uVar72 = vcmpps_avx512vl(ZEXT1632(auVar83),auVar88,5);
      auVar85 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar79 = (bool)((byte)uVar72 & 1);
      bVar10 = (bool)((byte)(uVar72 >> 1) & 1);
      bVar11 = (bool)((byte)(uVar72 >> 2) & 1);
      bVar12 = (bool)((byte)(uVar72 >> 3) & 1);
      bVar13 = (bool)((byte)(uVar72 >> 4) & 1);
      bVar14 = (bool)((byte)(uVar72 >> 5) & 1);
      bVar15 = (bool)((byte)(uVar72 >> 6) & 1);
      bVar16 = SUB81(uVar72 >> 7,0);
      local_58a0 = (uint)bVar79 * auVar85._0_4_ | (uint)!bVar79 * 0x60;
      uStack_589c = (uint)bVar10 * auVar85._4_4_ | (uint)!bVar10 * 0x60;
      uStack_5898 = (uint)bVar11 * auVar85._8_4_ | (uint)!bVar11 * 0x60;
      uStack_5894 = (uint)bVar12 * auVar85._12_4_ | (uint)!bVar12 * 0x60;
      uStack_5890 = (uint)bVar13 * auVar85._16_4_ | (uint)!bVar13 * 0x60;
      uStack_588c = (uint)bVar14 * auVar85._20_4_ | (uint)!bVar14 * 0x60;
      uStack_5888 = (uint)bVar15 * auVar85._24_4_ | (uint)!bVar15 * 0x60;
      uStack_5884 = (uint)bVar16 * auVar85._28_4_ | (uint)!bVar16 * 0x60;
      uVar72 = vcmpps_avx512vl(ZEXT1632(auVar122),auVar88,5);
      auVar85 = vpbroadcastd_avx512vl(ZEXT416(0x80));
      bVar79 = (bool)((byte)uVar72 & 1);
      bVar10 = (bool)((byte)(uVar72 >> 1) & 1);
      bVar11 = (bool)((byte)(uVar72 >> 2) & 1);
      bVar12 = (bool)((byte)(uVar72 >> 3) & 1);
      bVar13 = (bool)((byte)(uVar72 >> 4) & 1);
      bVar14 = (bool)((byte)(uVar72 >> 5) & 1);
      bVar15 = (bool)((byte)(uVar72 >> 6) & 1);
      bVar16 = SUB81(uVar72 >> 7,0);
      local_5880 = (uint)bVar79 * auVar85._0_4_ | (uint)!bVar79 * 0xa0;
      uStack_587c = (uint)bVar10 * auVar85._4_4_ | (uint)!bVar10 * 0xa0;
      uStack_5878 = (uint)bVar11 * auVar85._8_4_ | (uint)!bVar11 * 0xa0;
      uStack_5874 = (uint)bVar12 * auVar85._12_4_ | (uint)!bVar12 * 0xa0;
      uStack_5870 = (uint)bVar13 * auVar85._16_4_ | (uint)!bVar13 * 0xa0;
      uStack_586c = (uint)bVar14 * auVar85._20_4_ | (uint)!bVar14 * 0xa0;
      uStack_5868 = (uint)bVar15 * auVar85._24_4_ | (uint)!bVar15 * 0xa0;
      uStack_5864 = (uint)bVar16 * auVar85._28_4_ | (uint)!bVar16 * 0xa0;
      local_4680 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar203 = ZEXT3264(local_4680);
      local_5d64 = (undefined4)uVar80;
      auVar85 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar88);
      local_5860._0_4_ =
           (uint)(local_5dbc & 1) * auVar85._0_4_ | (uint)!(bool)(local_5dbc & 1) * local_4680._0_4_
      ;
      bVar79 = (bool)((byte)(uVar80 >> 1) & 1);
      local_5860._4_4_ = (uint)bVar79 * auVar85._4_4_ | (uint)!bVar79 * local_4680._4_4_;
      bVar79 = (bool)((byte)(uVar80 >> 2) & 1);
      local_5860._8_4_ = (uint)bVar79 * auVar85._8_4_ | (uint)!bVar79 * local_4680._8_4_;
      bVar79 = (bool)((byte)(uVar80 >> 3) & 1);
      local_5860._12_4_ = (uint)bVar79 * auVar85._12_4_ | (uint)!bVar79 * local_4680._12_4_;
      bVar79 = (bool)((byte)(uVar80 >> 4) & 1);
      local_5860._16_4_ = (uint)bVar79 * auVar85._16_4_ | (uint)!bVar79 * local_4680._16_4_;
      bVar79 = (bool)((byte)(uVar80 >> 5) & 1);
      local_5860._20_4_ = (uint)bVar79 * auVar85._20_4_ | (uint)!bVar79 * local_4680._20_4_;
      bVar79 = (bool)((byte)(uVar80 >> 6) & 1);
      local_5860._24_4_ = (uint)bVar79 * auVar85._24_4_ | (uint)!bVar79 * local_4680._24_4_;
      bVar79 = SUB81(uVar80 >> 7,0);
      local_5860._28_4_ = (uint)bVar79 * auVar85._28_4_ | (uint)!bVar79 * local_4680._28_4_;
      auVar85 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar202 = ZEXT3264(auVar85);
      auVar88 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar88);
      bVar79 = (bool)((byte)(uVar80 >> 1) & 1);
      bVar10 = (bool)((byte)(uVar80 >> 2) & 1);
      bVar11 = (bool)((byte)(uVar80 >> 3) & 1);
      bVar12 = (bool)((byte)(uVar80 >> 4) & 1);
      bVar13 = (bool)((byte)(uVar80 >> 5) & 1);
      bVar14 = (bool)((byte)(uVar80 >> 6) & 1);
      bVar15 = SUB81(uVar80 >> 7,0);
      local_5840._4_4_ = (uint)bVar79 * auVar88._4_4_ | (uint)!bVar79 * auVar85._4_4_;
      local_5840._0_4_ =
           (uint)(local_5dbc & 1) * auVar88._0_4_ | (uint)!(bool)(local_5dbc & 1) * auVar85._0_4_;
      local_5840._8_4_ = (uint)bVar10 * auVar88._8_4_ | (uint)!bVar10 * auVar85._8_4_;
      local_5840._12_4_ = (uint)bVar11 * auVar88._12_4_ | (uint)!bVar11 * auVar85._12_4_;
      local_5840._16_4_ = (uint)bVar12 * auVar88._16_4_ | (uint)!bVar12 * auVar85._16_4_;
      local_5840._20_4_ = (uint)bVar13 * auVar88._20_4_ | (uint)!bVar13 * auVar85._20_4_;
      local_5840._24_4_ = (uint)bVar14 * auVar88._24_4_ | (uint)!bVar14 * auVar85._24_4_;
      local_5840._28_4_ = (uint)bVar15 * auVar88._28_4_ | (uint)!bVar15 * auVar85._28_4_;
      local_5dbc = ~local_5dbc;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar80 = 7;
      }
      else {
        uVar80 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                        RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
      }
      local_5d70 = ray + 0x100;
      puVar78 = local_5800;
      local_5810 = 0xfffffffffffffff8;
      pauVar75 = (undefined1 (*) [32])local_4640;
      local_4660 = local_5860;
      local_5cc8 = (undefined1 (*) [32])&local_5aa0;
      auVar82 = vxorps_avx512vl(in_ZMM27._0_16_,in_ZMM27._0_16_);
      auVar204 = ZEXT1664(auVar82);
      auVar85 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar205 = ZEXT3264(auVar85);
LAB_007c6453:
      do {
        auVar85 = auVar202._0_32_;
        do {
          root.ptr = puVar78[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_007c7786;
          puVar78 = puVar78 + -1;
          local_5cc0 = pauVar75[-1];
          auVar198 = ZEXT3264(local_5cc0);
          pauVar75 = pauVar75 + -1;
          uVar72 = vcmpps_avx512vl(local_5cc0,local_5840,1);
        } while ((char)uVar72 == '\0');
        uVar71 = CONCAT44(0,POPCOUNT((int)uVar72));
        if (uVar80 < uVar71) {
LAB_007c64a2:
          do {
            lVar74 = -0x20;
            uVar72 = 8;
            auVar85 = auVar202._0_32_;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_007c7786;
              uVar20 = vcmpps_avx512vl(auVar198._0_32_,local_5840,9);
              if ((char)uVar20 != '\0') {
                local_5c90 = (ulong)((uint)root.ptr & 0xf) - 8;
                bVar69 = local_5dbc;
                if (local_5c90 != 0) {
                  bVar69 = ~local_5dbc;
                  uVar72 = 0;
                  do {
                    local_5c88 = uVar72;
                    lVar74 = uVar72 * 0x60 + (root.ptr & 0xfffffffffffffff0);
                    local_5d80 = 0;
                    local_5d78 = (ulong)bVar69;
                    for (uVar72 = local_5d78; (uVar72 & 1) == 0;
                        uVar72 = uVar72 >> 1 | 0x8000000000000000) {
                      local_5d80 = local_5d80 + 1;
                    }
                    uVar72 = 0;
                    bVar76 = bVar69;
                    while( true ) {
                      auVar82 = auVar204._0_16_;
                      auVar108 = in_ZMM20._0_32_;
                      auVar197 = auVar198._0_28_;
                      auVar179 = auVar182._0_28_;
                      auVar185 = auVar186._0_28_;
                      if (*(int *)(lVar74 + 0x50 + uVar72 * 4) == -1) break;
                      pGVar5 = (context->scene->geometries).items
                               [*(uint *)(lVar74 + 0x40 + uVar72 * 4)].ptr;
                      BVar3 = pGVar5->time_range;
                      auVar83._8_8_ = 0;
                      auVar83._0_4_ = BVar3.lower;
                      auVar83._4_4_ = BVar3.upper;
                      fVar114 = pGVar5->fnumTimeSegments;
                      auVar122._4_4_ = fVar114;
                      auVar122._0_4_ = fVar114;
                      auVar122._8_4_ = fVar114;
                      auVar122._12_4_ = fVar114;
                      fVar113 = BVar3.lower;
                      auVar132._4_4_ = fVar113;
                      auVar132._0_4_ = fVar113;
                      auVar132._8_4_ = fVar113;
                      auVar132._12_4_ = fVar113;
                      auVar132._16_4_ = fVar113;
                      auVar132._20_4_ = fVar113;
                      auVar132._24_4_ = fVar113;
                      auVar132._28_4_ = fVar113;
                      auVar85 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar132);
                      auVar84 = vmovshdup_avx(auVar83);
                      auVar83 = vsubps_avx(auVar84,auVar83);
                      auVar115._0_4_ = auVar83._0_4_;
                      auVar115._4_4_ = auVar115._0_4_;
                      auVar115._8_4_ = auVar115._0_4_;
                      auVar115._12_4_ = auVar115._0_4_;
                      auVar115._16_4_ = auVar115._0_4_;
                      auVar115._20_4_ = auVar115._0_4_;
                      auVar115._24_4_ = auVar115._0_4_;
                      auVar115._28_4_ = auVar115._0_4_;
                      auVar85 = vdivps_avx(auVar85,auVar115);
                      auVar46._4_4_ = fVar114 * auVar85._4_4_;
                      auVar46._0_4_ = fVar114 * auVar85._0_4_;
                      auVar46._8_4_ = fVar114 * auVar85._8_4_;
                      auVar46._12_4_ = fVar114 * auVar85._12_4_;
                      auVar46._16_4_ = fVar114 * auVar85._16_4_;
                      auVar46._20_4_ = fVar114 * auVar85._20_4_;
                      auVar46._24_4_ = fVar114 * auVar85._24_4_;
                      auVar46._28_4_ = auVar85._28_4_;
                      auVar85 = vroundps_avx(auVar46,1);
                      auVar83 = vaddss_avx512f(auVar122,SUB6416(ZEXT464(0xbf800000),0));
                      auVar123._0_4_ = auVar83._0_4_;
                      auVar123._4_4_ = auVar123._0_4_;
                      auVar123._8_4_ = auVar123._0_4_;
                      auVar123._12_4_ = auVar123._0_4_;
                      auVar123._16_4_ = auVar123._0_4_;
                      auVar123._20_4_ = auVar123._0_4_;
                      auVar123._24_4_ = auVar123._0_4_;
                      auVar123._28_4_ = auVar123._0_4_;
                      auVar85 = vminps_avx(auVar85,auVar123);
                      auVar89 = auVar204._0_32_;
                      auVar85 = vmaxps_avx512vl(auVar85,auVar89);
                      auVar17 = vcvtps2dq_avx(auVar85);
                      local_5d60 = auVar17;
                      auVar85 = vsubps_avx(auVar46,auVar85);
                      auVar88 = vpbroadcastd_avx512vl();
                      uVar20 = vpcmpeqd_avx512vl(auVar88,auVar17);
                      if ((byte)((byte)uVar20 | ~bVar69) == 0xff) {
                        lVar6 = *(long *)(*(long *)&pGVar5[2].numPrimitives +
                                         (long)*(int *)(local_5d60 + local_5d80 * 4) * 0x38);
                        lVar7 = *(long *)(*(long *)&pGVar5[2].numPrimitives + 0x38 +
                                         (long)*(int *)(local_5d60 + local_5d80 * 4) * 0x38);
                        uVar71 = (ulong)*(uint *)(lVar74 + uVar72 * 4);
                        uVar77 = (ulong)*(uint *)(lVar74 + 0x10 + uVar72 * 4);
                        auVar93 = vsubps_avx512vl(auVar201._0_32_,auVar85);
                        uVar187 = *(undefined4 *)(lVar7 + uVar71 * 4);
                        auVar22._4_4_ = uVar187;
                        auVar22._0_4_ = uVar187;
                        auVar22._8_4_ = uVar187;
                        auVar22._12_4_ = uVar187;
                        auVar22._16_4_ = uVar187;
                        auVar22._20_4_ = uVar187;
                        auVar22._24_4_ = uVar187;
                        auVar22._28_4_ = uVar187;
                        auVar88 = vmulps_avx512vl(auVar85,auVar22);
                        uVar187 = *(undefined4 *)(lVar7 + 4 + uVar71 * 4);
                        auVar23._4_4_ = uVar187;
                        auVar23._0_4_ = uVar187;
                        auVar23._8_4_ = uVar187;
                        auVar23._12_4_ = uVar187;
                        auVar23._16_4_ = uVar187;
                        auVar23._20_4_ = uVar187;
                        auVar23._24_4_ = uVar187;
                        auVar23._28_4_ = uVar187;
                        auVar86 = vmulps_avx512vl(auVar85,auVar23);
                        uVar187 = *(undefined4 *)(lVar7 + 8 + uVar71 * 4);
                        auVar24._4_4_ = uVar187;
                        auVar24._0_4_ = uVar187;
                        auVar24._8_4_ = uVar187;
                        auVar24._12_4_ = uVar187;
                        auVar24._16_4_ = uVar187;
                        auVar24._20_4_ = uVar187;
                        auVar24._24_4_ = uVar187;
                        auVar24._28_4_ = uVar187;
                        auVar87 = vmulps_avx512vl(auVar85,auVar24);
                        uVar187 = *(undefined4 *)(lVar6 + uVar71 * 4);
                        auVar25._4_4_ = uVar187;
                        auVar25._0_4_ = uVar187;
                        auVar25._8_4_ = uVar187;
                        auVar25._12_4_ = uVar187;
                        auVar25._16_4_ = uVar187;
                        auVar25._20_4_ = uVar187;
                        auVar25._24_4_ = uVar187;
                        auVar25._28_4_ = uVar187;
                        auVar94 = vfmadd231ps_avx512vl(auVar88,auVar93,auVar25);
                        uVar187 = *(undefined4 *)(lVar6 + 4 + uVar71 * 4);
                        auVar26._4_4_ = uVar187;
                        auVar26._0_4_ = uVar187;
                        auVar26._8_4_ = uVar187;
                        auVar26._12_4_ = uVar187;
                        auVar26._16_4_ = uVar187;
                        auVar26._20_4_ = uVar187;
                        auVar26._24_4_ = uVar187;
                        auVar26._28_4_ = uVar187;
                        auVar95 = vfmadd231ps_avx512vl(auVar86,auVar93,auVar26);
                        uVar187 = *(undefined4 *)(lVar6 + 8 + uVar71 * 4);
                        auVar27._4_4_ = uVar187;
                        auVar27._0_4_ = uVar187;
                        auVar27._8_4_ = uVar187;
                        auVar27._12_4_ = uVar187;
                        auVar27._16_4_ = uVar187;
                        auVar27._20_4_ = uVar187;
                        auVar27._24_4_ = uVar187;
                        auVar27._28_4_ = uVar187;
                        auVar96 = vfmadd231ps_avx512vl(auVar87,auVar93,auVar27);
                        uVar187 = *(undefined4 *)(lVar7 + uVar77 * 4);
                        auVar28._4_4_ = uVar187;
                        auVar28._0_4_ = uVar187;
                        auVar28._8_4_ = uVar187;
                        auVar28._12_4_ = uVar187;
                        auVar28._16_4_ = uVar187;
                        auVar28._20_4_ = uVar187;
                        auVar28._24_4_ = uVar187;
                        auVar28._28_4_ = uVar187;
                        auVar88 = vmulps_avx512vl(auVar85,auVar28);
                        uVar187 = *(undefined4 *)(lVar7 + 4 + uVar77 * 4);
                        auVar29._4_4_ = uVar187;
                        auVar29._0_4_ = uVar187;
                        auVar29._8_4_ = uVar187;
                        auVar29._12_4_ = uVar187;
                        auVar29._16_4_ = uVar187;
                        auVar29._20_4_ = uVar187;
                        auVar29._24_4_ = uVar187;
                        auVar29._28_4_ = uVar187;
                        auVar86 = vmulps_avx512vl(auVar85,auVar29);
                        uVar187 = *(undefined4 *)(lVar7 + 8 + uVar77 * 4);
                        auVar30._4_4_ = uVar187;
                        auVar30._0_4_ = uVar187;
                        auVar30._8_4_ = uVar187;
                        auVar30._12_4_ = uVar187;
                        auVar30._16_4_ = uVar187;
                        auVar30._20_4_ = uVar187;
                        auVar30._24_4_ = uVar187;
                        auVar30._28_4_ = uVar187;
                        auVar87 = vmulps_avx512vl(auVar85,auVar30);
                        uVar187 = *(undefined4 *)(lVar6 + uVar77 * 4);
                        auVar31._4_4_ = uVar187;
                        auVar31._0_4_ = uVar187;
                        auVar31._8_4_ = uVar187;
                        auVar31._12_4_ = uVar187;
                        auVar31._16_4_ = uVar187;
                        auVar31._20_4_ = uVar187;
                        auVar31._24_4_ = uVar187;
                        auVar31._28_4_ = uVar187;
                        auVar92 = vfmadd231ps_avx512vl(auVar88,auVar93,auVar31);
                        uVar187 = *(undefined4 *)(lVar6 + 4 + uVar77 * 4);
                        auVar32._4_4_ = uVar187;
                        auVar32._0_4_ = uVar187;
                        auVar32._8_4_ = uVar187;
                        auVar32._12_4_ = uVar187;
                        auVar32._16_4_ = uVar187;
                        auVar32._20_4_ = uVar187;
                        auVar32._24_4_ = uVar187;
                        auVar32._28_4_ = uVar187;
                        auVar97 = vfmadd231ps_avx512vl(auVar86,auVar93,auVar32);
                        uVar187 = *(undefined4 *)(lVar6 + 8 + uVar77 * 4);
                        auVar33._4_4_ = uVar187;
                        auVar33._0_4_ = uVar187;
                        auVar33._8_4_ = uVar187;
                        auVar33._12_4_ = uVar187;
                        auVar33._16_4_ = uVar187;
                        auVar33._20_4_ = uVar187;
                        auVar33._24_4_ = uVar187;
                        auVar33._28_4_ = uVar187;
                        auVar98 = vfmadd231ps_avx512vl(auVar87,auVar93,auVar33);
                        uVar71 = (ulong)*(uint *)(lVar74 + 0x20 + uVar72 * 4);
                        uVar187 = *(undefined4 *)(lVar7 + uVar71 * 4);
                        auVar34._4_4_ = uVar187;
                        auVar34._0_4_ = uVar187;
                        auVar34._8_4_ = uVar187;
                        auVar34._12_4_ = uVar187;
                        auVar34._16_4_ = uVar187;
                        auVar34._20_4_ = uVar187;
                        auVar34._24_4_ = uVar187;
                        auVar34._28_4_ = uVar187;
                        auVar88 = vmulps_avx512vl(auVar85,auVar34);
                        uVar187 = *(undefined4 *)(lVar7 + 4 + uVar71 * 4);
                        auVar35._4_4_ = uVar187;
                        auVar35._0_4_ = uVar187;
                        auVar35._8_4_ = uVar187;
                        auVar35._12_4_ = uVar187;
                        auVar35._16_4_ = uVar187;
                        auVar35._20_4_ = uVar187;
                        auVar35._24_4_ = uVar187;
                        auVar35._28_4_ = uVar187;
                        auVar86 = vmulps_avx512vl(auVar85,auVar35);
                        uVar187 = *(undefined4 *)(lVar7 + 8 + uVar71 * 4);
                        auVar36._4_4_ = uVar187;
                        auVar36._0_4_ = uVar187;
                        auVar36._8_4_ = uVar187;
                        auVar36._12_4_ = uVar187;
                        auVar36._16_4_ = uVar187;
                        auVar36._20_4_ = uVar187;
                        auVar36._24_4_ = uVar187;
                        auVar36._28_4_ = uVar187;
                        auVar87 = vmulps_avx512vl(auVar85,auVar36);
                        uVar187 = *(undefined4 *)(lVar6 + uVar71 * 4);
                        auVar37._4_4_ = uVar187;
                        auVar37._0_4_ = uVar187;
                        auVar37._8_4_ = uVar187;
                        auVar37._12_4_ = uVar187;
                        auVar37._16_4_ = uVar187;
                        auVar37._20_4_ = uVar187;
                        auVar37._24_4_ = uVar187;
                        auVar37._28_4_ = uVar187;
                        auVar99 = vfmadd231ps_avx512vl(auVar88,auVar93,auVar37);
                        uVar187 = *(undefined4 *)(lVar6 + 4 + uVar71 * 4);
                        auVar38._4_4_ = uVar187;
                        auVar38._0_4_ = uVar187;
                        auVar38._8_4_ = uVar187;
                        auVar38._12_4_ = uVar187;
                        auVar38._16_4_ = uVar187;
                        auVar38._20_4_ = uVar187;
                        auVar38._24_4_ = uVar187;
                        auVar38._28_4_ = uVar187;
                        auVar86 = vfmadd231ps_avx512vl(auVar86,auVar93,auVar38);
                        uVar187 = *(undefined4 *)(lVar6 + 8 + uVar71 * 4);
                        auVar39._4_4_ = uVar187;
                        auVar39._0_4_ = uVar187;
                        auVar39._8_4_ = uVar187;
                        auVar39._12_4_ = uVar187;
                        auVar39._16_4_ = uVar187;
                        auVar39._20_4_ = uVar187;
                        auVar39._24_4_ = uVar187;
                        auVar39._28_4_ = uVar187;
                        auVar87 = vfmadd231ps_avx512vl(auVar87,auVar93,auVar39);
                        uVar71 = (ulong)*(uint *)(lVar74 + 0x30 + uVar72 * 4);
                        uVar187 = *(undefined4 *)(lVar7 + uVar71 * 4);
                        auVar40._4_4_ = uVar187;
                        auVar40._0_4_ = uVar187;
                        auVar40._8_4_ = uVar187;
                        auVar40._12_4_ = uVar187;
                        auVar40._16_4_ = uVar187;
                        auVar40._20_4_ = uVar187;
                        auVar40._24_4_ = uVar187;
                        auVar40._28_4_ = uVar187;
                        auVar88 = vmulps_avx512vl(auVar85,auVar40);
                        uVar187 = *(undefined4 *)(lVar7 + 4 + uVar71 * 4);
                        auVar41._4_4_ = uVar187;
                        auVar41._0_4_ = uVar187;
                        auVar41._8_4_ = uVar187;
                        auVar41._12_4_ = uVar187;
                        auVar41._16_4_ = uVar187;
                        auVar41._20_4_ = uVar187;
                        auVar41._24_4_ = uVar187;
                        auVar41._28_4_ = uVar187;
                        auVar91 = vmulps_avx512vl(auVar85,auVar41);
                        uVar187 = *(undefined4 *)(lVar7 + 8 + uVar71 * 4);
                        auVar42._4_4_ = uVar187;
                        auVar42._0_4_ = uVar187;
                        auVar42._8_4_ = uVar187;
                        auVar42._12_4_ = uVar187;
                        auVar42._16_4_ = uVar187;
                        auVar42._20_4_ = uVar187;
                        auVar42._24_4_ = uVar187;
                        auVar42._28_4_ = uVar187;
                        auVar85 = vmulps_avx512vl(auVar85,auVar42);
                        uVar187 = *(undefined4 *)(lVar6 + uVar71 * 4);
                        auVar43._4_4_ = uVar187;
                        auVar43._0_4_ = uVar187;
                        auVar43._8_4_ = uVar187;
                        auVar43._12_4_ = uVar187;
                        auVar43._16_4_ = uVar187;
                        auVar43._20_4_ = uVar187;
                        auVar43._24_4_ = uVar187;
                        auVar43._28_4_ = uVar187;
                        auVar90 = vfmadd231ps_avx512vl(auVar88,auVar93,auVar43);
                        uVar187 = *(undefined4 *)(lVar6 + 4 + uVar71 * 4);
                        auVar44._4_4_ = uVar187;
                        auVar44._0_4_ = uVar187;
                        auVar44._8_4_ = uVar187;
                        auVar44._12_4_ = uVar187;
                        auVar44._16_4_ = uVar187;
                        auVar44._20_4_ = uVar187;
                        auVar44._24_4_ = uVar187;
                        auVar44._28_4_ = uVar187;
                        local_5cc0 = vfmadd231ps_avx512vl(auVar91,auVar93,auVar44);
                        uVar187 = *(undefined4 *)(lVar6 + 8 + uVar71 * 4);
                        auVar45._4_4_ = uVar187;
                        auVar45._0_4_ = uVar187;
                        auVar45._8_4_ = uVar187;
                        auVar45._12_4_ = uVar187;
                        auVar45._16_4_ = uVar187;
                        auVar45._20_4_ = uVar187;
                        auVar45._24_4_ = uVar187;
                        auVar45._28_4_ = uVar187;
                        local_5c80 = vfmadd231ps_avx512vl(auVar85,auVar93,auVar45);
                      }
                      else {
                        aRVar136 = (RTCHitN  [32])ZEXT1632(auVar84);
                        pRVar67 = local_5d20;
                        if (bVar69 != 0) {
                          lVar6 = *(long *)&pGVar5[2].numPrimitives;
                          uVar81 = (ulong)*(uint *)(lVar74 + uVar72 * 4);
                          uVar77 = local_5d78;
                          uVar71 = local_5d80;
                          do {
                            auVar84 = *(undefined1 (*) [16])
                                       (*(long *)(lVar6 + (long)*(int *)(local_5d60 + uVar71 * 4) *
                                                          0x38) + uVar81 * 4);
                            auVar83 = *(undefined1 (*) [16])
                                       (*(long *)(lVar6 + 0x38 +
                                                 (long)*(int *)(local_5d60 + uVar71 * 4) * 0x38) +
                                       uVar81 * 4);
                            *(int *)(local_5b80 + uVar71 * 4) = auVar84._0_4_;
                            uVar187 = vextractps_avx(auVar84,1);
                            *(undefined4 *)(local_5b60 + uVar71 * 4) = uVar187;
                            uVar187 = vextractps_avx(auVar84,2);
                            *(undefined4 *)(local_5b40 + uVar71 * 4) = uVar187;
                            *(int *)(local_5d40 + uVar71 * 4) = auVar83._0_4_;
                            uVar187 = vextractps_avx(auVar83,1);
                            *(undefined4 *)((long)&local_5d20 + uVar71 * 4) = uVar187;
                            fVar114 = (float)vextractps_avx(auVar83,2);
                            local_5d00[uVar71] = fVar114;
                            uVar77 = uVar77 ^ 1L << (uVar71 & 0x3f);
                            uVar71 = 0;
                            for (uVar18 = uVar77; (uVar18 & 1) == 0;
                                uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                              uVar71 = uVar71 + 1;
                            }
                          } while (uVar77 != 0);
                          auVar17._8_8_ = local_5d40._8_8_;
                          auVar17._0_8_ = local_5d40._0_8_;
                          auVar17._16_8_ = local_5d40._16_8_;
                          auVar17._24_8_ = local_5d40._24_8_;
                          aRVar136 = local_5b80;
                          pRVar67 = local_5d20;
                        }
                        local_5d20._4_4_ = (float)((ulong)pRVar67 >> 0x20);
                        local_5d20._0_4_ = SUB84(pRVar67,0);
                        auVar88 = vsubps_avx512vl(auVar201._0_32_,auVar85);
                        fVar121 = auVar88._0_4_;
                        fVar137 = fVar121 * (float)local_5b60._0_4_;
                        fVar124 = auVar88._4_4_;
                        fVar139 = fVar124 * (float)local_5b60._4_4_;
                        fVar125 = auVar88._8_4_;
                        fVar140 = fVar125 * fStack_5b58;
                        fVar126 = auVar88._12_4_;
                        fVar141 = fVar126 * fStack_5b54;
                        fVar127 = auVar88._16_4_;
                        fVar142 = fVar127 * fStack_5b50;
                        fVar128 = auVar88._20_4_;
                        fVar143 = fVar128 * fStack_5b4c;
                        fVar129 = auVar88._24_4_;
                        fVar144 = fVar129 * fStack_5b48;
                        fVar145 = fVar121 * (float)local_5b40._0_4_;
                        fVar150 = fVar124 * (float)local_5b40._4_4_;
                        fVar151 = fVar125 * fStack_5b38;
                        fVar152 = fVar126 * fStack_5b34;
                        fVar153 = fVar127 * fStack_5b30;
                        fVar154 = fVar128 * fStack_5b2c;
                        fVar155 = fVar129 * fStack_5b28;
                        fVar114 = auVar85._0_4_;
                        fVar156 = fVar114 * (float)local_5d20;
                        fVar113 = auVar85._4_4_;
                        fVar161 = fVar113 * local_5d20._4_4_;
                        fVar116 = auVar85._8_4_;
                        fVar162 = fVar116 * fStack_5d18;
                        fVar117 = auVar85._12_4_;
                        fVar163 = fVar117 * fStack_5d14;
                        fVar118 = auVar85._16_4_;
                        fVar164 = fVar118 * fStack_5d10;
                        fVar119 = auVar85._20_4_;
                        fVar165 = fVar119 * fStack_5d0c;
                        fVar120 = auVar85._24_4_;
                        fVar166 = fVar120 * fStack_5d08;
                        fVar167 = fVar114 * local_5d00[0];
                        fVar173 = fVar113 * local_5d00[1];
                        fVar174 = fVar116 * local_5d00[2];
                        fVar175 = fVar117 * local_5d00[3];
                        fVar176 = fVar118 * fStack_5cf0;
                        fVar177 = fVar119 * fStack_5cec;
                        fVar178 = fVar120 * fStack_5ce8;
                        if (bVar69 != 0) {
                          lVar6 = *(long *)&pGVar5[2].numPrimitives;
                          uVar81 = (ulong)*(uint *)(lVar74 + 0x10 + uVar72 * 4);
                          uVar77 = local_5d78;
                          uVar71 = local_5d80;
                          local_5d20 = pRVar67;
                          do {
                            auVar84 = *(undefined1 (*) [16])
                                       (*(long *)(lVar6 + (long)*(int *)(local_5d60 + uVar71 * 4) *
                                                          0x38) + uVar81 * 4);
                            auVar83 = *(undefined1 (*) [16])
                                       (*(long *)(lVar6 + 0x38 +
                                                 (long)*(int *)(local_5d60 + uVar71 * 4) * 0x38) +
                                       uVar81 * 4);
                            *(int *)(local_5b80 + uVar71 * 4) = auVar84._0_4_;
                            uVar187 = vextractps_avx(auVar84,1);
                            *(undefined4 *)(local_5b60 + uVar71 * 4) = uVar187;
                            uVar187 = vextractps_avx(auVar84,2);
                            *(undefined4 *)(local_5b40 + uVar71 * 4) = uVar187;
                            *(int *)(local_5d40 + uVar71 * 4) = auVar83._0_4_;
                            uVar187 = vextractps_avx(auVar83,1);
                            *(undefined4 *)((long)&local_5d20 + uVar71 * 4) = uVar187;
                            fVar4 = (float)vextractps_avx(auVar83,2);
                            local_5d00[uVar71] = fVar4;
                            uVar77 = uVar77 ^ 1L << (uVar71 & 0x3f);
                            uVar71 = 0;
                            for (uVar18 = uVar77; (uVar18 & 1) == 0;
                                uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                              uVar71 = uVar71 + 1;
                            }
                          } while (uVar77 != 0);
                          auVar185 = local_5b80._0_28_;
                          auVar64._8_8_ = local_5d40._8_8_;
                          auVar64._0_8_ = local_5d40._0_8_;
                          auVar64._16_8_ = local_5d40._16_8_;
                          auVar64._24_8_ = local_5d40._24_8_;
                          auVar179 = auVar64._0_28_;
                          pRVar67 = local_5d20;
                        }
                        local_5d20._4_4_ = (float)((ulong)pRVar67 >> 0x20);
                        local_5d20._0_4_ = SUB84(pRVar67,0);
                        auVar182._0_4_ = fVar121 * (float)local_5b60._0_4_;
                        auVar182._4_4_ = fVar124 * (float)local_5b60._4_4_;
                        auVar182._8_4_ = fVar125 * fStack_5b58;
                        auVar182._12_4_ = fVar126 * fStack_5b54;
                        auVar182._16_4_ = fVar127 * fStack_5b50;
                        auVar182._20_4_ = fVar128 * fStack_5b4c;
                        auVar182._28_36_ = in_ZMM10._28_36_;
                        auVar182._24_4_ = fVar129 * fStack_5b48;
                        auVar186._0_4_ = fVar121 * (float)local_5b40._0_4_;
                        auVar186._4_4_ = fVar124 * (float)local_5b40._4_4_;
                        auVar186._8_4_ = fVar125 * fStack_5b38;
                        auVar186._12_4_ = fVar126 * fStack_5b34;
                        auVar186._16_4_ = fVar127 * fStack_5b30;
                        auVar186._20_4_ = fVar128 * fStack_5b2c;
                        auVar186._28_36_ = in_ZMM11._28_36_;
                        auVar186._24_4_ = fVar129 * fStack_5b28;
                        auVar198._0_4_ = fVar114 * (float)local_5d20;
                        auVar198._4_4_ = fVar113 * local_5d20._4_4_;
                        auVar198._8_4_ = fVar116 * fStack_5d18;
                        auVar198._12_4_ = fVar117 * fStack_5d14;
                        auVar198._16_4_ = fVar118 * fStack_5d10;
                        auVar198._20_4_ = fVar119 * fStack_5d0c;
                        auVar198._28_36_ = in_ZMM12._28_36_;
                        auVar198._24_4_ = fVar120 * fStack_5d08;
                        auVar191._0_4_ = fVar114 * local_5d00[0];
                        auVar191._4_4_ = fVar113 * local_5d00[1];
                        auVar191._8_4_ = fVar116 * local_5d00[2];
                        auVar191._12_4_ = fVar117 * local_5d00[3];
                        auVar191._16_4_ = fVar118 * fStack_5cf0;
                        auVar191._20_4_ = fVar119 * fStack_5cec;
                        auVar191._28_36_ = in_ZMM13._28_36_;
                        auVar191._24_4_ = fVar120 * fStack_5ce8;
                        local_5d20 = pRVar67;
                        if (bVar69 != 0) {
                          lVar6 = *(long *)&pGVar5[2].numPrimitives;
                          uVar81 = (ulong)*(uint *)(lVar74 + 0x20 + uVar72 * 4);
                          uVar77 = local_5d78;
                          uVar71 = local_5d80;
                          do {
                            auVar84 = *(undefined1 (*) [16])
                                       (*(long *)(lVar6 + (long)*(int *)(local_5d60 + uVar71 * 4) *
                                                          0x38) + uVar81 * 4);
                            auVar83 = *(undefined1 (*) [16])
                                       (*(long *)(lVar6 + 0x38 +
                                                 (long)*(int *)(local_5d60 + uVar71 * 4) * 0x38) +
                                       uVar81 * 4);
                            *(int *)(local_5b80 + uVar71 * 4) = auVar84._0_4_;
                            uVar187 = vextractps_avx(auVar84,1);
                            *(undefined4 *)(local_5b60 + uVar71 * 4) = uVar187;
                            uVar187 = vextractps_avx(auVar84,2);
                            *(undefined4 *)(local_5b40 + uVar71 * 4) = uVar187;
                            *(int *)(local_5d40 + uVar71 * 4) = auVar83._0_4_;
                            uVar187 = vextractps_avx(auVar83,1);
                            *(undefined4 *)((long)&local_5d20 + uVar71 * 4) = uVar187;
                            fVar4 = (float)vextractps_avx(auVar83,2);
                            local_5d00[uVar71] = fVar4;
                            uVar77 = uVar77 ^ 1L << (uVar71 & 0x3f);
                            uVar71 = 0;
                            for (uVar18 = uVar77; (uVar18 & 1) == 0;
                                uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                              uVar71 = uVar71 + 1;
                            }
                          } while (uVar77 != 0);
                          auVar197 = local_5b80._0_28_;
                          in_ZMM14 = ZEXT3264(CONCAT824(local_5d40._24_8_,
                                                        CONCAT816(local_5d40._16_8_,
                                                                  CONCAT88(local_5d40._8_8_,
                                                                           local_5d40._0_8_))));
                        }
                        auVar86 = vmulps_avx512vl(auVar88,_local_5b60);
                        auVar87 = vmulps_avx512vl(auVar88,_local_5b40);
                        auVar65._8_4_ = fStack_5d18;
                        auVar65._0_8_ = local_5d20;
                        auVar65._12_4_ = fStack_5d14;
                        auVar65._16_4_ = fStack_5d10;
                        auVar65._20_4_ = fStack_5d0c;
                        auVar65._24_4_ = fStack_5d08;
                        auVar65._28_4_ = uStack_5d04;
                        auVar90 = vmulps_avx512vl(auVar85,auVar65);
                        auVar66._4_4_ = local_5d00[1];
                        auVar66._0_4_ = local_5d00[0];
                        auVar66._8_4_ = local_5d00[2];
                        auVar66._12_4_ = local_5d00[3];
                        auVar66._16_4_ = fStack_5cf0;
                        auVar66._20_4_ = fStack_5cec;
                        auVar66._24_4_ = fStack_5ce8;
                        auVar66._28_4_ = uStack_5ce4;
                        auVar91 = vmulps_avx512vl(auVar85,auVar66);
                        aRVar199 = (RTCHitN  [32])in_ZMM21._0_32_;
                        pRVar67 = local_5d20;
                        if (bVar69 != 0) {
                          lVar6 = *(long *)&pGVar5[2].numPrimitives;
                          uVar81 = (ulong)*(uint *)(lVar74 + 0x30 + uVar72 * 4);
                          uVar77 = local_5d78;
                          uVar71 = local_5d80;
                          do {
                            auVar84 = vmovdqu64_avx512vl(*(undefined1 (*) [16])
                                                          (*(long *)(lVar6 + (long)*(int *)(
                                                  local_5d60 + uVar71 * 4) * 0x38) + uVar81 * 4));
                            auVar83 = vmovdqu64_avx512vl(*(undefined1 (*) [16])
                                                          (*(long *)(lVar6 + 0x38 +
                                                                    (long)*(int *)(local_5d60 +
                                                                                  uVar71 * 4) * 0x38
                                                                    ) + uVar81 * 4));
                            *(int *)(local_5b80 + uVar71 * 4) = auVar84._0_4_;
                            uVar187 = vextractps_avx512f(auVar84,1);
                            *(undefined4 *)(local_5b60 + uVar71 * 4) = uVar187;
                            uVar187 = vextractps_avx512f(auVar84,2);
                            *(undefined4 *)(local_5b40 + uVar71 * 4) = uVar187;
                            *(int *)(local_5d40 + uVar71 * 4) = auVar83._0_4_;
                            uVar187 = vextractps_avx512f(auVar83,1);
                            *(undefined4 *)((long)&local_5d20 + uVar71 * 4) = uVar187;
                            fVar4 = (float)vextractps_avx512f(auVar83,2);
                            local_5d00[uVar71] = fVar4;
                            uVar77 = uVar77 ^ 1L << (uVar71 & 0x3f);
                            uVar71 = 0;
                            for (uVar18 = uVar77; (uVar18 & 1) == 0;
                                uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                              uVar71 = uVar71 + 1;
                            }
                          } while (uVar77 != 0);
                          auVar108._8_8_ = local_5d40._8_8_;
                          auVar108._0_8_ = local_5d40._0_8_;
                          auVar108._16_8_ = local_5d40._16_8_;
                          auVar108._24_8_ = local_5d40._24_8_;
                          aRVar199 = local_5b80;
                          pRVar67 = local_5d20;
                        }
                        local_5d20._4_4_ = (float)((ulong)pRVar67 >> 0x20);
                        local_5d20._0_4_ = SUB84(pRVar67,0);
                        auVar94._0_4_ = fVar121 * aRVar136._0_4_ + fVar114 * auVar17._0_4_;
                        auVar94._4_4_ = fVar124 * aRVar136._4_4_ + fVar113 * auVar17._4_4_;
                        auVar94._8_4_ = fVar125 * aRVar136._8_4_ + fVar116 * auVar17._8_4_;
                        auVar94._12_4_ = fVar126 * aRVar136._12_4_ + fVar117 * auVar17._12_4_;
                        auVar94._16_4_ = fVar127 * aRVar136._16_4_ + fVar118 * auVar17._16_4_;
                        auVar94._20_4_ = fVar128 * aRVar136._20_4_ + fVar119 * auVar17._20_4_;
                        auVar94._24_4_ = fVar129 * aRVar136._24_4_ + fVar120 * auVar17._24_4_;
                        auVar94._28_4_ = aRVar136._28_4_ + auVar17._28_4_;
                        auVar95._0_4_ = fVar137 + fVar156;
                        auVar95._4_4_ = fVar139 + fVar161;
                        auVar95._8_4_ = fVar140 + fVar162;
                        auVar95._12_4_ = fVar141 + fVar163;
                        auVar95._16_4_ = fVar142 + fVar164;
                        auVar95._20_4_ = fVar143 + fVar165;
                        auVar95._24_4_ = fVar144 + fVar166;
                        fVar137 = auVar160._28_4_;
                        fVar139 = auVar138._28_4_;
                        auVar95._28_4_ = fVar139 + fVar137;
                        auVar96._0_4_ = fVar145 + fVar167;
                        auVar96._4_4_ = fVar150 + fVar173;
                        auVar96._8_4_ = fVar151 + fVar174;
                        auVar96._12_4_ = fVar152 + fVar175;
                        auVar96._16_4_ = fVar153 + fVar176;
                        auVar96._20_4_ = fVar154 + fVar177;
                        auVar96._24_4_ = fVar155 + fVar178;
                        auVar96._28_4_ = auVar149._28_4_ + auVar172._28_4_;
                        auVar51._4_4_ = auVar185._4_4_ * fVar124;
                        auVar51._0_4_ = auVar185._0_4_ * fVar121;
                        auVar51._8_4_ = auVar185._8_4_ * fVar125;
                        auVar51._12_4_ = auVar185._12_4_ * fVar126;
                        auVar51._16_4_ = auVar185._16_4_ * fVar127;
                        auVar51._20_4_ = auVar185._20_4_ * fVar128;
                        auVar51._24_4_ = auVar185._24_4_ * fVar129;
                        auVar51._28_4_ = fVar139;
                        auVar52._4_4_ = auVar179._4_4_ * fVar113;
                        auVar52._0_4_ = auVar179._0_4_ * fVar114;
                        auVar52._8_4_ = auVar179._8_4_ * fVar116;
                        auVar52._12_4_ = auVar179._12_4_ * fVar117;
                        auVar52._16_4_ = auVar179._16_4_ * fVar118;
                        auVar52._20_4_ = auVar179._20_4_ * fVar119;
                        auVar52._24_4_ = auVar179._24_4_ * fVar120;
                        auVar52._28_4_ = fVar137;
                        auVar92 = vaddps_avx512vl(auVar51,auVar52);
                        auVar97 = vaddps_avx512vl(auVar182._0_32_,auVar198._0_32_);
                        auVar98 = vaddps_avx512vl(auVar186._0_32_,auVar191._0_32_);
                        auVar99._0_4_ = auVar197._0_4_ * fVar121 + in_ZMM14._0_4_ * fVar114;
                        auVar99._4_4_ = auVar197._4_4_ * fVar124 + in_ZMM14._4_4_ * fVar113;
                        auVar99._8_4_ = auVar197._8_4_ * fVar125 + in_ZMM14._8_4_ * fVar116;
                        auVar99._12_4_ = auVar197._12_4_ * fVar126 + in_ZMM14._12_4_ * fVar117;
                        auVar99._16_4_ = auVar197._16_4_ * fVar127 + in_ZMM14._16_4_ * fVar118;
                        auVar99._20_4_ = auVar197._20_4_ * fVar128 + in_ZMM14._20_4_ * fVar119;
                        auVar99._24_4_ = auVar197._24_4_ * fVar129 + in_ZMM14._24_4_ * fVar120;
                        auVar99._28_4_ = fVar139 + fVar137;
                        auVar86 = vaddps_avx512vl(auVar86,auVar90);
                        auVar87 = vaddps_avx512vl(auVar87,auVar91);
                        auVar91 = vmulps_avx512vl(auVar88,(undefined1  [32])aRVar199);
                        auVar93._4_4_ = fVar124 * (float)local_5b40._4_4_;
                        auVar93._0_4_ = fVar121 * (float)local_5b40._0_4_;
                        auVar93._8_4_ = fVar125 * fStack_5b38;
                        auVar93._12_4_ = fVar126 * fStack_5b34;
                        auVar93._16_4_ = fVar127 * fStack_5b30;
                        auVar93._20_4_ = fVar128 * fStack_5b2c;
                        auVar93._24_4_ = fVar129 * fStack_5b28;
                        auVar93._28_4_ = auVar88._28_4_;
                        auVar90 = vmulps_avx512vl(auVar85,auVar108);
                        auVar90 = vaddps_avx512vl(auVar91,auVar90);
                        local_5cc0._0_4_ =
                             fVar121 * (float)local_5b60._0_4_ + fVar114 * (float)local_5d20;
                        local_5cc0._4_4_ =
                             fVar124 * (float)local_5b60._4_4_ + fVar113 * local_5d20._4_4_;
                        local_5cc0._8_4_ = fVar125 * fStack_5b58 + fVar116 * fStack_5d18;
                        local_5cc0._12_4_ = fVar126 * fStack_5b54 + fVar117 * fStack_5d14;
                        local_5cc0._16_4_ = fVar127 * fStack_5b50 + fVar118 * fStack_5d10;
                        local_5cc0._20_4_ = fVar128 * fStack_5b4c + fVar119 * fStack_5d0c;
                        local_5cc0._24_4_ = fVar129 * fStack_5b48 + fVar120 * fStack_5d08;
                        local_5cc0._28_4_ = auVar86._28_4_ + auVar91._28_4_;
                        local_5c80._0_4_ =
                             fVar121 * (float)local_5b40._0_4_ + fVar114 * local_5d00[0];
                        local_5c80._4_4_ =
                             fVar124 * (float)local_5b40._4_4_ + fVar113 * local_5d00[1];
                        local_5c80._8_4_ = fVar125 * fStack_5b38 + fVar116 * local_5d00[2];
                        local_5c80._12_4_ = fVar126 * fStack_5b34 + fVar117 * local_5d00[3];
                        local_5c80._16_4_ = fVar127 * fStack_5b30 + fVar118 * fStack_5cf0;
                        local_5c80._20_4_ = fVar128 * fStack_5b2c + fVar119 * fStack_5cec;
                        local_5c80._24_4_ = fVar129 * fStack_5b28 + fVar120 * fStack_5ce8;
                        local_5c80._28_4_ = auVar88._28_4_ + auVar85._28_4_;
                        local_5d20 = pRVar67;
                      }
                      in_ZMM21 = ZEXT3264(auVar90);
                      in_ZMM20 = ZEXT3264(auVar87);
                      auVar100 = vsubps_avx512vl(auVar94,auVar92);
                      in_ZMM10 = ZEXT3264(auVar100);
                      auVar101 = vsubps_avx512vl(auVar95,auVar97);
                      in_ZMM11 = ZEXT3264(auVar101);
                      auVar102 = vsubps_avx512vl(auVar96,auVar98);
                      in_ZMM12 = ZEXT3264(auVar102);
                      auVar103 = vsubps_avx512vl(auVar90,auVar94);
                      auVar198 = ZEXT3264(auVar103);
                      auVar104 = vsubps_avx512vl(local_5cc0,auVar95);
                      auVar105 = vsubps_avx512vl(local_5c80,auVar96);
                      auVar85 = vmulps_avx512vl(auVar101,auVar105);
                      auVar106 = vfmsub231ps_avx512vl(auVar85,auVar104,auVar102);
                      auVar63._4_4_ = auVar102._4_4_ * auVar103._4_4_;
                      auVar63._0_4_ = auVar102._0_4_ * auVar103._0_4_;
                      auVar63._8_4_ = auVar102._8_4_ * auVar103._8_4_;
                      auVar63._12_4_ = auVar102._12_4_ * auVar103._12_4_;
                      auVar63._16_4_ = auVar102._16_4_ * auVar103._16_4_;
                      auVar63._20_4_ = auVar102._20_4_ * auVar103._20_4_;
                      auVar63._24_4_ = auVar102._24_4_ * auVar103._24_4_;
                      auVar63._28_4_ = auVar93._28_4_;
                      auVar107 = vfmsub231ps_avx512vl(auVar63,auVar105,auVar100);
                      uVar2 = auVar107._28_4_;
                      auVar131 = ZEXT436(uVar2);
                      auVar130 = ZEXT436(uVar2);
                      auVar108 = vmulps_avx512vl(auVar100,auVar104);
                      auVar122 = vfmsub231ps_fma(auVar108,auVar103,auVar101);
                      auVar138 = ZEXT1664(auVar122);
                      auVar109 = vsubps_avx(auVar94,*(undefined1 (*) [32])ray);
                      auVar160 = ZEXT3264(auVar109);
                      auVar110 = vsubps_avx(auVar95,*(undefined1 (*) [32])(ray + 0x20));
                      auVar172 = ZEXT3264(auVar110);
                      auVar111 = vsubps_avx(auVar96,*(undefined1 (*) [32])(ray + 0x40));
                      auVar186 = ZEXT3264(auVar111);
                      auVar85 = *(undefined1 (*) [32])(ray + 0x80);
                      auVar88 = *(undefined1 (*) [32])(ray + 0xa0);
                      auVar91 = *(undefined1 (*) [32])(ray + 0xc0);
                      auVar47._4_4_ = auVar88._4_4_ * auVar111._4_4_;
                      auVar47._0_4_ = auVar88._0_4_ * auVar111._0_4_;
                      auVar47._8_4_ = auVar88._8_4_ * auVar111._8_4_;
                      auVar47._12_4_ = auVar88._12_4_ * auVar111._12_4_;
                      auVar47._16_4_ = auVar88._16_4_ * auVar111._16_4_;
                      auVar47._20_4_ = auVar88._20_4_ * auVar111._20_4_;
                      auVar47._24_4_ = auVar88._24_4_ * auVar111._24_4_;
                      auVar47._28_4_ = auVar94._28_4_;
                      auVar184 = vfmsub231ps_fma(auVar47,auVar110,auVar91);
                      auVar48._4_4_ = auVar91._4_4_ * auVar109._4_4_;
                      auVar48._0_4_ = auVar91._0_4_ * auVar109._0_4_;
                      auVar48._8_4_ = auVar91._8_4_ * auVar109._8_4_;
                      auVar48._12_4_ = auVar91._12_4_ * auVar109._12_4_;
                      auVar48._16_4_ = auVar91._16_4_ * auVar109._16_4_;
                      auVar48._20_4_ = auVar91._20_4_ * auVar109._20_4_;
                      auVar48._24_4_ = auVar91._24_4_ * auVar109._24_4_;
                      auVar48._28_4_ = auVar96._28_4_;
                      auVar157 = vfmsub231ps_fma(auVar48,auVar111,auVar85);
                      auVar149 = ZEXT1664(auVar157);
                      auVar195._0_4_ = auVar85._0_4_ * auVar110._0_4_;
                      auVar195._4_4_ = auVar85._4_4_ * auVar110._4_4_;
                      auVar195._8_4_ = auVar85._8_4_ * auVar110._8_4_;
                      auVar195._12_4_ = auVar85._12_4_ * auVar110._12_4_;
                      auVar195._16_4_ = auVar85._16_4_ * auVar110._16_4_;
                      auVar195._20_4_ = auVar85._20_4_ * auVar110._20_4_;
                      auVar195._28_36_ = in_ZMM14._28_36_;
                      auVar195._24_4_ = auVar85._24_4_ * auVar110._24_4_;
                      auVar183 = vfmsub231ps_fma(auVar195._0_32_,auVar109,auVar88);
                      in_ZMM14 = ZEXT1664(auVar183);
                      auVar49._4_4_ = auVar91._4_4_ * auVar122._4_4_;
                      auVar49._0_4_ = auVar91._0_4_ * auVar122._0_4_;
                      auVar49._8_4_ = auVar91._8_4_ * auVar122._8_4_;
                      auVar49._12_4_ = auVar91._12_4_ * auVar122._12_4_;
                      auVar49._16_4_ = auVar91._16_4_ * 0.0;
                      auVar49._20_4_ = auVar91._20_4_ * 0.0;
                      auVar49._24_4_ = auVar91._24_4_ * 0.0;
                      auVar49._28_4_ = auVar91._28_4_;
                      auVar84 = vfmadd231ps_fma(auVar49,auVar107,auVar88);
                      auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar106,auVar85);
                      auVar182 = ZEXT1664(auVar84);
                      vandps_avx512vl(ZEXT1632(auVar84),auVar205._0_32_);
                      in_ZMM13 = ZEXT3264(auVar108);
                      auVar85 = vmulps_avx512vl(auVar105,ZEXT1632(auVar183));
                      auVar85 = vfmadd231ps_avx512vl(auVar85,ZEXT1632(auVar157),auVar104);
                      auVar83 = vfmadd231ps_fma(auVar85,ZEXT1632(auVar184),auVar103);
                      uVar189 = auVar108._0_4_;
                      auVar135._0_4_ = (float)(uVar189 ^ auVar83._0_4_);
                      uVar192 = auVar108._4_4_;
                      auVar135._4_4_ = (float)(uVar192 ^ auVar83._4_4_);
                      uVar193 = auVar108._8_4_;
                      auVar135._8_4_ = (float)(uVar193 ^ auVar83._8_4_);
                      uVar194 = auVar108._12_4_;
                      auVar135._12_4_ = (float)(uVar194 ^ auVar83._12_4_);
                      fVar114 = auVar108._16_4_;
                      auVar135._16_4_ = fVar114;
                      fVar113 = auVar108._20_4_;
                      auVar135._20_4_ = fVar113;
                      fVar116 = auVar108._24_4_;
                      auVar135._24_4_ = fVar116;
                      uVar187 = auVar108._28_4_;
                      auVar135._28_4_ = uVar187;
                      uVar20 = vcmpps_avx512vl(auVar135,auVar89,5);
                      bVar73 = (byte)uVar20 & bVar76;
                      auVar133 = (undefined1  [36])0x0;
                      if (bVar73 != 0) {
                        auVar188._0_4_ = auVar102._0_4_ * auVar183._0_4_;
                        auVar188._4_4_ = auVar102._4_4_ * auVar183._4_4_;
                        auVar188._8_4_ = auVar102._8_4_ * auVar183._8_4_;
                        auVar188._12_4_ = auVar102._12_4_ * auVar183._12_4_;
                        auVar53._16_4_ = auVar102._16_4_ * 0.0;
                        auVar53._0_16_ = auVar188;
                        auVar53._20_4_ = auVar102._20_4_ * 0.0;
                        auVar53._24_4_ = auVar102._24_4_ * 0.0;
                        auVar53._28_4_ = auVar102._28_4_;
                        in_ZMM12 = ZEXT3264(auVar53);
                        auVar83 = vfmadd213ps_fma(auVar101,ZEXT1632(auVar157),auVar53);
                        in_ZMM11 = ZEXT1664(auVar83);
                        auVar184 = vfmadd213ps_fma(auVar100,ZEXT1632(auVar184),ZEXT1632(auVar83));
                        in_ZMM10 = ZEXT1664(auVar184);
                        auVar147._0_4_ = (float)(uVar189 ^ auVar184._0_4_);
                        auVar147._4_4_ = (float)(uVar192 ^ auVar184._4_4_);
                        auVar147._8_4_ = (float)(uVar193 ^ auVar184._8_4_);
                        auVar147._12_4_ = (float)(uVar194 ^ auVar184._12_4_);
                        auVar147._16_4_ = fVar114;
                        auVar147._20_4_ = fVar113;
                        auVar147._24_4_ = fVar116;
                        auVar147._28_4_ = uVar187;
                        auVar149 = ZEXT3264(auVar147);
                        uVar20 = vcmpps_avx512vl(auVar147,auVar89,5);
                        bVar73 = bVar73 & (byte)uVar20;
                        auVar133 = (undefined1  [36])0x0;
                        if (bVar73 != 0) {
                          vandps_avx512vl(ZEXT1632(auVar84),auVar200._0_32_);
                          uVar68 = auVar85._28_4_;
                          auVar134 = ZEXT436(uVar68);
                          auVar133 = ZEXT436(uVar68);
                          auVar88 = vsubps_avx(auVar85,auVar135);
                          in_ZMM10 = ZEXT3264(auVar88);
                          uVar20 = vcmpps_avx512vl(auVar88,auVar147,5);
                          bVar73 = bVar73 & (byte)uVar20;
                          if (bVar73 != 0) {
                            local_5c60 = auVar90;
                            local_5c40 = auVar87;
                            local_5c20 = auVar86;
                            local_5c00 = auVar99;
                            local_5be0 = auVar98;
                            local_5bc0 = auVar97;
                            local_5ba0 = auVar92;
                            in_ZMM10 = ZEXT864(0) << 0x20;
                            auVar57._4_4_ = auVar111._4_4_ * auVar122._4_4_;
                            auVar57._0_4_ = auVar111._0_4_ * auVar122._0_4_;
                            auVar57._8_4_ = auVar111._8_4_ * auVar122._8_4_;
                            auVar57._12_4_ = auVar111._12_4_ * auVar122._12_4_;
                            auVar57._16_4_ = auVar111._16_4_ * 0.0;
                            auVar57._20_4_ = auVar111._20_4_ * 0.0;
                            auVar57._24_4_ = auVar111._24_4_ * 0.0;
                            auVar57._28_4_ = auVar111._28_4_;
                            auVar184 = vfmadd213ps_fma(auVar110,auVar107,auVar57);
                            auVar184 = vfmadd213ps_fma(auVar109,auVar106,ZEXT1632(auVar184));
                            auVar157._0_4_ = uVar189 ^ auVar184._0_4_;
                            auVar157._4_4_ = uVar192 ^ auVar184._4_4_;
                            auVar157._8_4_ = uVar193 ^ auVar184._8_4_;
                            auVar157._12_4_ = uVar194 ^ auVar184._12_4_;
                            auVar159._16_4_ = fVar114;
                            auVar159._0_16_ = auVar157;
                            auVar159._20_4_ = fVar113;
                            auVar159._24_4_ = fVar116;
                            auVar159._28_4_ = uVar187;
                            auVar160 = ZEXT3264(auVar159);
                            auVar170._0_4_ = auVar85._0_4_ * *(float *)(ray + 0x60);
                            auVar170._4_4_ = auVar85._4_4_ * *(float *)(ray + 100);
                            auVar170._8_4_ = auVar85._8_4_ * *(float *)(ray + 0x68);
                            auVar170._12_4_ = auVar85._12_4_ * *(float *)(ray + 0x6c);
                            auVar170._16_4_ = auVar85._16_4_ * *(float *)(ray + 0x70);
                            auVar170._20_4_ = auVar85._20_4_ * *(float *)(ray + 0x74);
                            auVar170._24_4_ = auVar85._24_4_ * *(float *)(ray + 0x78);
                            auVar170._28_4_ = 0;
                            auVar172 = ZEXT3264(auVar170);
                            local_5a60 = *(float *)(ray + 0x100);
                            fStack_5a5c = *(float *)(ray + 0x104);
                            fStack_5a58 = *(float *)(ray + 0x108);
                            fStack_5a54 = *(float *)(ray + 0x10c);
                            fStack_5a50 = *(float *)(ray + 0x110);
                            fStack_5a4c = *(float *)(ray + 0x114);
                            fStack_5a48 = *(float *)(ray + 0x118);
                            iStack_5a44 = *(int *)(ray + 0x11c);
                            auVar184._0_4_ = *(float *)(ray + 0x100) * auVar85._0_4_;
                            auVar184._4_4_ = *(float *)(ray + 0x104) * auVar85._4_4_;
                            auVar184._8_4_ = *(float *)(ray + 0x108) * auVar85._8_4_;
                            auVar184._12_4_ = *(float *)(ray + 0x10c) * auVar85._12_4_;
                            auVar58._16_4_ = *(float *)(ray + 0x110) * auVar85._16_4_;
                            auVar58._0_16_ = auVar184;
                            auVar58._20_4_ = *(float *)(ray + 0x114) * auVar85._20_4_;
                            auVar58._24_4_ = *(float *)(ray + 0x118) * auVar85._24_4_;
                            auVar58._28_4_ = *(int *)(ray + 0x11c);
                            auVar186 = ZEXT3264(auVar58);
                            uVar20 = vcmpps_avx512vl(auVar159,auVar58,2);
                            uVar21 = vcmpps_avx512vl(auVar170,auVar159,1);
                            bVar73 = bVar73 & (byte)uVar20 & (byte)uVar21;
                            if (bVar73 == 0) {
LAB_007c71ff:
                              auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar88 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                              auVar89 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                              auVar86 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                              auVar82 = vxorps_avx512vl(auVar82,auVar82);
                              auVar87 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                              auVar130 = ZEXT436(uVar2);
                            }
                            else {
                              uVar20 = vcmpps_avx512vl(ZEXT1632(auVar84),ZEXT832(0) << 0x20,4);
                              bVar73 = bVar73 & (byte)uVar20;
                              if (bVar73 == 0) goto LAB_007c71ff;
                              uVar189 = pGVar5->mask;
                              auVar171._4_4_ = uVar189;
                              auVar171._0_4_ = uVar189;
                              auVar171._8_4_ = uVar189;
                              auVar171._12_4_ = uVar189;
                              auVar171._16_4_ = uVar189;
                              auVar171._20_4_ = uVar189;
                              auVar171._24_4_ = uVar189;
                              auVar171._28_4_ = uVar189;
                              auVar172 = ZEXT3264(auVar171);
                              uVar20 = vptestmd_avx512vl(auVar171,*(undefined1 (*) [32])
                                                                   (ray + 0x120));
                              bVar73 = bVar73 & (byte)uVar20;
                              if (bVar73 == 0) goto LAB_007c71ff;
                              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                 (auVar134 = ZEXT436(uVar68),
                                 pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                auVar88 = vrcp14ps_avx512vl(auVar85);
                                auVar181._8_4_ = 0x3f800000;
                                auVar181._0_8_ = 0x3f8000003f800000;
                                auVar181._12_4_ = 0x3f800000;
                                auVar181._16_4_ = 0x3f800000;
                                auVar181._20_4_ = 0x3f800000;
                                auVar181._24_4_ = 0x3f800000;
                                auVar181._28_4_ = 0x3f800000;
                                auVar84 = vfnmadd213ps_fma(auVar85,auVar88,auVar181);
                                auVar84 = vfmadd132ps_fma(ZEXT1632(auVar84),auVar88,auVar88);
                                auVar134 = (undefined1  [36])0x0;
                                auVar61._4_4_ = auVar84._4_4_ * auVar135._4_4_;
                                auVar61._0_4_ = auVar84._0_4_ * auVar135._0_4_;
                                auVar61._8_4_ = auVar84._8_4_ * auVar135._8_4_;
                                auVar61._12_4_ = auVar84._12_4_ * auVar135._12_4_;
                                auVar61._16_4_ = fVar114 * 0.0;
                                auVar61._20_4_ = fVar113 * 0.0;
                                auVar61._24_4_ = fVar116 * 0.0;
                                auVar61._28_4_ = uVar187;
                                local_5b20 = vminps_avx(auVar61,auVar181);
                                auVar62._4_4_ = auVar84._4_4_ * auVar147._4_4_;
                                auVar62._0_4_ = auVar84._0_4_ * auVar147._0_4_;
                                auVar62._8_4_ = auVar84._8_4_ * auVar147._8_4_;
                                auVar62._12_4_ = auVar84._12_4_ * auVar147._12_4_;
                                auVar62._16_4_ = fVar114 * 0.0;
                                auVar62._20_4_ = fVar113 * 0.0;
                                auVar62._24_4_ = fVar116 * 0.0;
                                auVar62._28_4_ = uVar187;
                                local_5b00 = vminps_avx(auVar62,auVar181);
                                auVar149 = ZEXT3264(local_5b00);
                                pRVar8 = context->user;
                                local_5ac0 = vpbroadcastd_avx512vl();
                                auVar172 = ZEXT3264(local_5ac0);
                                local_5ae0 = vpbroadcastd_avx512vl();
                                auVar182 = ZEXT3264(local_5ae0);
                                local_5b80[0] = (RTCHitN)auVar106[0];
                                local_5b80[1] = (RTCHitN)auVar106[1];
                                local_5b80[2] = (RTCHitN)auVar106[2];
                                local_5b80[3] = (RTCHitN)auVar106[3];
                                local_5b80[4] = (RTCHitN)auVar106[4];
                                local_5b80[5] = (RTCHitN)auVar106[5];
                                local_5b80[6] = (RTCHitN)auVar106[6];
                                local_5b80[7] = (RTCHitN)auVar106[7];
                                local_5b80[8] = (RTCHitN)auVar106[8];
                                local_5b80[9] = (RTCHitN)auVar106[9];
                                local_5b80[10] = (RTCHitN)auVar106[10];
                                local_5b80[0xb] = (RTCHitN)auVar106[0xb];
                                local_5b80[0xc] = (RTCHitN)auVar106[0xc];
                                local_5b80[0xd] = (RTCHitN)auVar106[0xd];
                                local_5b80[0xe] = (RTCHitN)auVar106[0xe];
                                local_5b80[0xf] = (RTCHitN)auVar106[0xf];
                                local_5b80[0x10] = (RTCHitN)auVar106[0x10];
                                local_5b80[0x11] = (RTCHitN)auVar106[0x11];
                                local_5b80[0x12] = (RTCHitN)auVar106[0x12];
                                local_5b80[0x13] = (RTCHitN)auVar106[0x13];
                                local_5b80[0x14] = (RTCHitN)auVar106[0x14];
                                local_5b80[0x15] = (RTCHitN)auVar106[0x15];
                                local_5b80[0x16] = (RTCHitN)auVar106[0x16];
                                local_5b80[0x17] = (RTCHitN)auVar106[0x17];
                                local_5b80[0x18] = (RTCHitN)auVar106[0x18];
                                local_5b80[0x19] = (RTCHitN)auVar106[0x19];
                                local_5b80[0x1a] = (RTCHitN)auVar106[0x1a];
                                local_5b80[0x1b] = (RTCHitN)auVar106[0x1b];
                                local_5b80[0x1c] = (RTCHitN)auVar106[0x1c];
                                local_5b80[0x1d] = (RTCHitN)auVar106[0x1d];
                                local_5b80[0x1e] = (RTCHitN)auVar106[0x1e];
                                local_5b80[0x1f] = (RTCHitN)auVar106[0x1f];
                                _local_5b60 = auVar107;
                                _local_5b40 = ZEXT1632(auVar122);
                                auVar85 = vpcmpeqd_avx2(auVar106,auVar106);
                                local_5cc8[1] = auVar85;
                                *local_5cc8 = auVar85;
                                local_5aa0 = pRVar8->instID[0];
                                uStack_5a9c = local_5aa0;
                                uStack_5a98 = local_5aa0;
                                uStack_5a94 = local_5aa0;
                                uStack_5a90 = local_5aa0;
                                uStack_5a8c = local_5aa0;
                                uStack_5a88 = local_5aa0;
                                uStack_5a84 = local_5aa0;
                                local_5a80 = pRVar8->instPrimID[0];
                                uStack_5a7c = local_5a80;
                                uStack_5a78 = local_5a80;
                                uStack_5a74 = local_5a80;
                                uStack_5a70 = local_5a80;
                                uStack_5a6c = local_5a80;
                                uStack_5a68 = local_5a80;
                                uStack_5a64 = local_5a80;
                                auVar85 = vmulps_avx512vl(ZEXT1632(auVar84),auVar159);
                                bVar79 = (bool)(bVar73 >> 1 & 1);
                                bVar10 = (bool)(bVar73 >> 2 & 1);
                                bVar11 = (bool)(bVar73 >> 3 & 1);
                                bVar12 = (bool)(bVar73 >> 4 & 1);
                                bVar13 = (bool)(bVar73 >> 5 & 1);
                                bVar14 = (bool)(bVar73 >> 6 & 1);
                                *(uint *)(ray + 0x100) =
                                     (uint)(bVar73 & 1) * auVar85._0_4_ |
                                     (uint)!(bool)(bVar73 & 1) * (int)local_5a60;
                                *(uint *)(ray + 0x104) =
                                     (uint)bVar79 * auVar85._4_4_ | (uint)!bVar79 * (int)fStack_5a5c
                                ;
                                *(uint *)(ray + 0x108) =
                                     (uint)bVar10 * auVar85._8_4_ | (uint)!bVar10 * (int)fStack_5a58
                                ;
                                *(uint *)(ray + 0x10c) =
                                     (uint)bVar11 * auVar85._12_4_ |
                                     (uint)!bVar11 * (int)fStack_5a54;
                                *(uint *)(ray + 0x110) =
                                     (uint)bVar12 * auVar85._16_4_ |
                                     (uint)!bVar12 * (int)fStack_5a50;
                                *(uint *)(ray + 0x114) =
                                     (uint)bVar13 * auVar85._20_4_ |
                                     (uint)!bVar13 * (int)fStack_5a4c;
                                *(uint *)(ray + 0x118) =
                                     (uint)bVar14 * auVar85._24_4_ |
                                     (uint)!bVar14 * (int)fStack_5a48;
                                *(uint *)(ray + 0x11c) =
                                     (uint)(bVar73 >> 7) * auVar85._28_4_ |
                                     (uint)!(bool)(bVar73 >> 7) * iStack_5a44;
                                local_5d60 = vpmovm2d_avx512vl((ulong)bVar73);
                                local_5d40._0_8_ = local_5d60;
                                local_5d40._8_8_ = pGVar5->userPtr;
                                local_5d40._16_8_ = context->user;
                                local_5d40._24_8_ = ray;
                                local_5d20._0_4_ = SUB84(local_5b80,0);
                                local_5d20._4_4_ = (float)((ulong)local_5b80 >> 0x20);
                                fStack_5d18 = 1.12104e-44;
                                local_5d20 = local_5b80;
                                auVar131 = ZEXT436(uVar2);
                                if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                  auVar134 = (undefined1  [36])0x0;
                                  auVar138 = ZEXT1664(auVar122);
                                  auVar149 = ZEXT1664(local_5b00._0_16_);
                                  auVar160 = ZEXT1664(auVar157);
                                  auVar172 = ZEXT1664(local_5ac0._0_16_);
                                  auVar182 = ZEXT1664(local_5ae0._0_16_);
                                  auVar186 = ZEXT1664(auVar184);
                                  in_ZMM10 = ZEXT864(0) << 0x20;
                                  in_ZMM11 = ZEXT1664(auVar83);
                                  in_ZMM12 = ZEXT1664(auVar188);
                                  in_ZMM13 = ZEXT1664(auVar108._0_16_);
                                  in_ZMM14 = ZEXT1664(auVar183);
                                  auVar198 = ZEXT1664(auVar103._0_16_);
                                  (*pGVar5->occlusionFilterN)
                                            ((RTCFilterFunctionNArguments *)local_5d40);
                                  auVar131 = extraout_var;
                                }
                                if (local_5d60 == (undefined1  [32])0x0) {
                                  uVar71 = 0;
                                }
                                else {
                                  p_Var9 = context->args->filter;
                                  if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                                     (((context->args->flags &
                                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                      (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                                    auVar134 = (undefined1  [36])0x0;
                                    auVar138 = ZEXT1664(auVar138._0_16_);
                                    auVar149 = ZEXT1664(auVar149._0_16_);
                                    auVar160 = ZEXT1664(auVar160._0_16_);
                                    auVar172 = ZEXT1664(auVar172._0_16_);
                                    auVar182 = ZEXT1664(auVar182._0_16_);
                                    auVar186 = ZEXT1664(auVar186._0_16_);
                                    in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
                                    in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
                                    in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                                    in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                                    in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                                    auVar198 = ZEXT1664(auVar198._0_16_);
                                    (*p_Var9)((RTCFilterFunctionNArguments *)local_5d40);
                                    auVar131 = extraout_var_00;
                                  }
                                  uVar71 = vptestmd_avx512vl(local_5d60,local_5d60);
                                  auVar85 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                  bVar79 = (bool)((byte)uVar71 & 1);
                                  bVar10 = (bool)((byte)(uVar71 >> 1) & 1);
                                  bVar11 = (bool)((byte)(uVar71 >> 2) & 1);
                                  bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
                                  bVar13 = (bool)((byte)(uVar71 >> 4) & 1);
                                  bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
                                  bVar15 = (bool)((byte)(uVar71 >> 6) & 1);
                                  bVar16 = SUB81(uVar71 >> 7,0);
                                  *(uint *)(local_5d40._24_8_ + 0x100) =
                                       (uint)bVar79 * auVar85._0_4_ |
                                       (uint)!bVar79 * *(int *)(local_5d40._24_8_ + 0x100);
                                  *(uint *)(local_5d40._24_8_ + 0x104) =
                                       (uint)bVar10 * auVar85._4_4_ |
                                       (uint)!bVar10 * *(int *)(local_5d40._24_8_ + 0x104);
                                  *(uint *)(local_5d40._24_8_ + 0x108) =
                                       (uint)bVar11 * auVar85._8_4_ |
                                       (uint)!bVar11 * *(int *)(local_5d40._24_8_ + 0x108);
                                  *(uint *)(local_5d40._24_8_ + 0x10c) =
                                       (uint)bVar12 * auVar85._12_4_ |
                                       (uint)!bVar12 * *(int *)(local_5d40._24_8_ + 0x10c);
                                  *(uint *)(local_5d40._24_8_ + 0x110) =
                                       (uint)bVar13 * auVar85._16_4_ |
                                       (uint)!bVar13 * *(int *)(local_5d40._24_8_ + 0x110);
                                  *(uint *)(local_5d40._24_8_ + 0x114) =
                                       (uint)bVar14 * auVar85._20_4_ |
                                       (uint)!bVar14 * *(int *)(local_5d40._24_8_ + 0x114);
                                  *(uint *)(local_5d40._24_8_ + 0x118) =
                                       (uint)bVar15 * auVar85._24_4_ |
                                       (uint)!bVar15 * *(int *)(local_5d40._24_8_ + 0x118);
                                  *(uint *)(local_5d40._24_8_ + 0x11c) =
                                       (uint)bVar16 * auVar85._28_4_ |
                                       (uint)!bVar16 * *(int *)(local_5d40._24_8_ + 0x11c);
                                }
                                bVar73 = (byte)uVar71;
                                bVar79 = (bool)((byte)(uVar71 >> 1) & 1);
                                bVar10 = (bool)((byte)(uVar71 >> 2) & 1);
                                bVar11 = (bool)((byte)(uVar71 >> 3) & 1);
                                bVar12 = (bool)((byte)(uVar71 >> 4) & 1);
                                bVar13 = (bool)((byte)(uVar71 >> 5) & 1);
                                bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
                                bVar15 = (bool)((byte)(uVar71 >> 7) & 1);
                                *(uint *)local_5d70 =
                                     (uint)(bVar73 & 1) * *(int *)local_5d70 |
                                     (uint)!(bool)(bVar73 & 1) * (int)local_5a60;
                                *(uint *)(local_5d70 + 4) =
                                     (uint)bVar79 * *(int *)(local_5d70 + 4) |
                                     (uint)!bVar79 * (int)fStack_5a5c;
                                *(uint *)(local_5d70 + 8) =
                                     (uint)bVar10 * *(int *)(local_5d70 + 8) |
                                     (uint)!bVar10 * (int)fStack_5a58;
                                *(uint *)(local_5d70 + 0xc) =
                                     (uint)bVar11 * *(int *)(local_5d70 + 0xc) |
                                     (uint)!bVar11 * (int)fStack_5a54;
                                *(uint *)(local_5d70 + 0x10) =
                                     (uint)bVar12 * *(int *)(local_5d70 + 0x10) |
                                     (uint)!bVar12 * (int)fStack_5a50;
                                *(uint *)(local_5d70 + 0x14) =
                                     (uint)bVar13 * *(int *)(local_5d70 + 0x14) |
                                     (uint)!bVar13 * (int)fStack_5a4c;
                                *(uint *)(local_5d70 + 0x18) =
                                     (uint)bVar14 * *(int *)(local_5d70 + 0x18) |
                                     (uint)!bVar14 * (int)fStack_5a48;
                                *(uint *)(local_5d70 + 0x1c) =
                                     (uint)bVar15 * *(int *)(local_5d70 + 0x1c) |
                                     (uint)!bVar15 * iStack_5a44;
                              }
                              bVar76 = bVar76 & ~bVar73;
                              auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar88 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                              auVar89 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                              auVar86 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                              auVar82 = vxorps_avx512vl(auVar82,auVar82);
                              auVar87 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                              auVar130 = auVar131;
                            }
                            auVar205 = ZEXT3264(auVar87);
                            auVar204 = ZEXT1664(auVar82);
                            auVar203 = ZEXT3264(auVar86);
                            auVar202 = ZEXT3264(auVar89);
                            auVar201 = ZEXT3264(auVar88);
                            auVar200 = ZEXT3264(auVar85);
                            in_ZMM20 = ZEXT3264(local_5c40);
                            in_ZMM21 = ZEXT3264(local_5c60);
                            auVar99 = local_5c00;
                            auVar86 = local_5c20;
                            auVar92 = local_5ba0;
                            auVar97 = local_5bc0;
                            auVar98 = local_5be0;
                            auVar133 = auVar134;
                          }
                        }
                      }
                      auVar82 = auVar204._0_16_;
                      if (bVar76 == 0) {
                        bVar76 = 0;
                        break;
                      }
                      auVar87 = vsubps_avx512vl(auVar99,in_ZMM21._0_32_);
                      auVar90 = vsubps_avx512vl(auVar86,local_5cc0);
                      auVar160 = ZEXT3264(auVar90);
                      auVar88 = in_ZMM20._0_32_;
                      auVar91 = vsubps_avx512vl(auVar88,local_5c80);
                      in_ZMM10 = ZEXT3264(auVar91);
                      auVar92 = vsubps_avx512vl(auVar92,auVar99);
                      auVar97 = vsubps_avx512vl(auVar97,auVar86);
                      auVar198 = ZEXT3264(auVar97);
                      auVar98 = vsubps_avx512vl(auVar98,auVar88);
                      auVar85 = vmulps_avx512vl(auVar90,auVar98);
                      auVar83 = vfmsub231ps_fma(auVar85,auVar97,auVar91);
                      auVar138._0_4_ = auVar91._0_4_ * auVar92._0_4_;
                      auVar138._4_4_ = auVar91._4_4_ * auVar92._4_4_;
                      auVar138._8_4_ = auVar91._8_4_ * auVar92._8_4_;
                      auVar138._12_4_ = auVar91._12_4_ * auVar92._12_4_;
                      auVar138._16_4_ = auVar91._16_4_ * auVar92._16_4_;
                      auVar138._20_4_ = auVar91._20_4_ * auVar92._20_4_;
                      auVar138._24_4_ = auVar91._24_4_ * auVar92._24_4_;
                      auVar138._28_36_ = auVar130;
                      auVar109 = vfmsub231ps_avx512vl(auVar138._0_32_,auVar98,auVar87);
                      auVar149._0_4_ = auVar97._0_4_ * auVar87._0_4_;
                      auVar149._4_4_ = auVar97._4_4_ * auVar87._4_4_;
                      auVar149._8_4_ = auVar97._8_4_ * auVar87._8_4_;
                      auVar149._12_4_ = auVar97._12_4_ * auVar87._12_4_;
                      auVar149._16_4_ = auVar97._16_4_ * auVar87._16_4_;
                      auVar149._20_4_ = auVar97._20_4_ * auVar87._20_4_;
                      auVar149._24_4_ = auVar97._24_4_ * auVar87._24_4_;
                      auVar149._28_36_ = auVar133;
                      auVar122 = vfmsub231ps_fma(auVar149._0_32_,auVar92,auVar90);
                      auVar110 = vsubps_avx512vl(auVar99,*(undefined1 (*) [32])ray);
                      auVar149 = ZEXT3264(auVar110);
                      auVar86 = vsubps_avx512vl(auVar86,*(undefined1 (*) [32])(ray + 0x20));
                      auVar172 = ZEXT3264(auVar86);
                      auVar111 = vsubps_avx512vl(auVar88,*(undefined1 (*) [32])(ray + 0x40));
                      auVar186 = ZEXT3264(auVar111);
                      auVar85 = *(undefined1 (*) [32])(ray + 0x80);
                      auVar88 = *(undefined1 (*) [32])(ray + 0xa0);
                      auVar89 = *(undefined1 (*) [32])(ray + 0xc0);
                      auVar100 = vmulps_avx512vl(auVar88,auVar111);
                      auVar184 = vfmsub231ps_fma(auVar100,auVar86,auVar89);
                      in_ZMM12 = ZEXT1664(auVar184);
                      auVar190._0_4_ = auVar89._0_4_ * auVar110._0_4_;
                      auVar190._4_4_ = auVar89._4_4_ * auVar110._4_4_;
                      auVar190._8_4_ = auVar89._8_4_ * auVar110._8_4_;
                      auVar190._12_4_ = auVar89._12_4_ * auVar110._12_4_;
                      auVar190._16_4_ = auVar89._16_4_ * auVar110._16_4_;
                      auVar190._20_4_ = auVar89._20_4_ * auVar110._20_4_;
                      auVar190._28_36_ = in_ZMM13._28_36_;
                      auVar190._24_4_ = auVar89._24_4_ * auVar110._24_4_;
                      auVar157 = vfmsub231ps_fma(auVar190._0_32_,auVar111,auVar85);
                      in_ZMM13 = ZEXT1664(auVar157);
                      auVar196._0_4_ = auVar85._0_4_ * auVar86._0_4_;
                      auVar196._4_4_ = auVar85._4_4_ * auVar86._4_4_;
                      auVar196._8_4_ = auVar85._8_4_ * auVar86._8_4_;
                      auVar196._12_4_ = auVar85._12_4_ * auVar86._12_4_;
                      auVar196._16_4_ = auVar85._16_4_ * auVar86._16_4_;
                      auVar196._20_4_ = auVar85._20_4_ * auVar86._20_4_;
                      auVar196._28_36_ = in_ZMM14._28_36_;
                      auVar196._24_4_ = auVar85._24_4_ * auVar86._24_4_;
                      auVar100 = vfmsub231ps_avx512vl(auVar196._0_32_,auVar110,auVar88);
                      in_ZMM14 = ZEXT3264(auVar100);
                      auVar50._4_4_ = auVar89._4_4_ * auVar122._4_4_;
                      auVar50._0_4_ = auVar89._0_4_ * auVar122._0_4_;
                      auVar50._8_4_ = auVar89._8_4_ * auVar122._8_4_;
                      auVar50._12_4_ = auVar89._12_4_ * auVar122._12_4_;
                      auVar50._16_4_ = auVar89._16_4_ * 0.0;
                      auVar50._20_4_ = auVar89._20_4_ * 0.0;
                      auVar50._24_4_ = auVar89._24_4_ * 0.0;
                      auVar50._28_4_ = auVar89._28_4_;
                      auVar88 = vfmadd231ps_avx512vl(auVar50,auVar109,auVar88);
                      auVar84 = vfmadd231ps_fma(auVar88,ZEXT1632(auVar83),auVar85);
                      auVar182 = ZEXT1664(auVar84);
                      vandps_avx512vl(ZEXT1632(auVar84),auVar205._0_32_);
                      in_ZMM11 = ZEXT3264(auVar88);
                      auVar85 = vmulps_avx512vl(auVar98,auVar100);
                      auVar85 = vfmadd231ps_avx512vl(auVar85,ZEXT1632(auVar157),auVar97);
                      auVar85 = vfmadd231ps_avx512vl(auVar85,ZEXT1632(auVar184),auVar92);
                      auVar85 = vxorps_avx512vl(auVar88,auVar85);
                      auVar138 = ZEXT3264(auVar85);
                      uVar20 = vcmpps_avx512vl(auVar85,auVar204._0_32_,5);
                      bVar73 = (byte)uVar20 & bVar76;
                      if (bVar73 != 0) {
                        auVar54._4_4_ = auVar91._4_4_ * auVar100._4_4_;
                        auVar54._0_4_ = auVar91._0_4_ * auVar100._0_4_;
                        auVar54._8_4_ = auVar91._8_4_ * auVar100._8_4_;
                        auVar54._12_4_ = auVar91._12_4_ * auVar100._12_4_;
                        auVar54._16_4_ = auVar91._16_4_ * auVar100._16_4_;
                        auVar54._20_4_ = auVar91._20_4_ * auVar100._20_4_;
                        auVar54._24_4_ = auVar91._24_4_ * auVar100._24_4_;
                        auVar54._28_4_ = auVar91._28_4_;
                        in_ZMM10 = ZEXT3264(auVar54);
                        auVar183 = vfmadd213ps_fma(auVar90,ZEXT1632(auVar157),auVar54);
                        auVar183 = vfmadd213ps_fma(auVar87,ZEXT1632(auVar184),ZEXT1632(auVar183));
                        auVar158._0_4_ = (float)(auVar88._0_4_ ^ auVar183._0_4_);
                        auVar158._4_4_ = (float)(auVar88._4_4_ ^ auVar183._4_4_);
                        auVar158._8_4_ = (float)(auVar88._8_4_ ^ auVar183._8_4_);
                        auVar158._12_4_ = (float)(auVar88._12_4_ ^ auVar183._12_4_);
                        fVar114 = auVar88._16_4_;
                        auVar158._16_4_ = fVar114;
                        fVar113 = auVar88._20_4_;
                        auVar158._20_4_ = fVar113;
                        fVar116 = auVar88._24_4_;
                        auVar158._24_4_ = fVar116;
                        uVar187 = auVar88._28_4_;
                        auVar158._28_4_ = uVar187;
                        auVar160 = ZEXT3264(auVar158);
                        uVar20 = vcmpps_avx512vl(auVar158,auVar204._0_32_,5);
                        bVar73 = bVar73 & (byte)uVar20;
                        if (bVar73 != 0) {
                          vandps_avx512vl(ZEXT1632(auVar84),auVar200._0_32_);
                          auVar89 = vsubps_avx(auVar85,auVar85);
                          in_ZMM10 = ZEXT3264(auVar89);
                          uVar20 = vcmpps_avx512vl(auVar89,auVar158,5);
                          bVar73 = bVar73 & (byte)uVar20;
                          if (bVar73 != 0) {
                            in_ZMM10 = ZEXT864(0) << 0x20;
                            auVar55._4_4_ = auVar111._4_4_ * auVar122._4_4_;
                            auVar55._0_4_ = auVar111._0_4_ * auVar122._0_4_;
                            auVar55._8_4_ = auVar111._8_4_ * auVar122._8_4_;
                            auVar55._12_4_ = auVar111._12_4_ * auVar122._12_4_;
                            auVar55._16_4_ = auVar111._16_4_ * 0.0;
                            auVar55._20_4_ = auVar111._20_4_ * 0.0;
                            auVar55._24_4_ = auVar111._24_4_ * 0.0;
                            auVar55._28_4_ = auVar111._28_4_;
                            auVar183 = vfmadd213ps_fma(auVar86,auVar109,auVar55);
                            auVar183 = vfmadd213ps_fma(auVar110,ZEXT1632(auVar83),ZEXT1632(auVar183)
                                                      );
                            auVar146._0_4_ = auVar88._0_4_ ^ auVar183._0_4_;
                            auVar146._4_4_ = auVar88._4_4_ ^ auVar183._4_4_;
                            auVar146._8_4_ = auVar88._8_4_ ^ auVar183._8_4_;
                            auVar146._12_4_ = auVar88._12_4_ ^ auVar183._12_4_;
                            auVar148._16_4_ = fVar114;
                            auVar148._0_16_ = auVar146;
                            auVar148._20_4_ = fVar113;
                            auVar148._24_4_ = fVar116;
                            auVar148._28_4_ = uVar187;
                            auVar149 = ZEXT3264(auVar148);
                            fVar117 = auVar85._0_4_;
                            auVar168._0_4_ = fVar117 * *(float *)(ray + 0x60);
                            fVar118 = auVar85._4_4_;
                            auVar168._4_4_ = fVar118 * *(float *)(ray + 100);
                            fVar119 = auVar85._8_4_;
                            auVar168._8_4_ = fVar119 * *(float *)(ray + 0x68);
                            fVar120 = auVar85._12_4_;
                            auVar168._12_4_ = fVar120 * *(float *)(ray + 0x6c);
                            fVar121 = auVar85._16_4_;
                            auVar168._16_4_ = fVar121 * *(float *)(ray + 0x70);
                            fVar124 = auVar85._20_4_;
                            auVar168._20_4_ = fVar124 * *(float *)(ray + 0x74);
                            fVar125 = auVar85._24_4_;
                            auVar168._24_4_ = fVar125 * *(float *)(ray + 0x78);
                            auVar168._28_4_ = 0;
                            auVar172 = ZEXT3264(auVar168);
                            pRVar1 = ray + 0x100;
                            auVar179 = *(undefined1 (*) [28])pRVar1;
                            iVar70 = *(int *)(ray + 0x11c);
                            local_5c80 = *(undefined1 (*) [32])pRVar1;
                            auVar89 = local_5c80;
                            auVar183._0_4_ = *(float *)pRVar1 * fVar117;
                            auVar183._4_4_ = *(float *)(ray + 0x104) * fVar118;
                            auVar183._8_4_ = *(float *)(ray + 0x108) * fVar119;
                            auVar183._12_4_ = *(float *)(ray + 0x10c) * fVar120;
                            auVar56._16_4_ = *(float *)(ray + 0x110) * fVar121;
                            auVar56._0_16_ = auVar183;
                            auVar56._20_4_ = *(float *)(ray + 0x114) * fVar124;
                            auVar56._24_4_ = *(float *)(ray + 0x118) * fVar125;
                            auVar56._28_4_ = iVar70;
                            auVar186 = ZEXT3264(auVar56);
                            uVar20 = vcmpps_avx512vl(auVar148,auVar56,2);
                            uVar21 = vcmpps_avx512vl(auVar168,auVar148,1);
                            bVar73 = bVar73 & (byte)uVar20 & (byte)uVar21;
                            if (bVar73 == 0) {
LAB_007c71aa:
                              auVar88 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar85 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                              auVar89 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                              auVar86 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                              auVar82 = vxorps_avx512vl(auVar82,auVar82);
                              auVar87 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                            }
                            else {
                              uVar20 = vcmpps_avx512vl(ZEXT1632(auVar84),ZEXT832(0) << 0x20,4);
                              bVar73 = bVar73 & (byte)uVar20;
                              if (bVar73 == 0) goto LAB_007c71aa;
                              pGVar5 = (context->scene->geometries).items
                                       [*(uint *)(lVar74 + 0x40 + uVar72 * 4)].ptr;
                              local_5cc0._0_8_ = pGVar5;
                              uVar2 = pGVar5->mask;
                              auVar169._4_4_ = uVar2;
                              auVar169._0_4_ = uVar2;
                              auVar169._8_4_ = uVar2;
                              auVar169._12_4_ = uVar2;
                              auVar169._16_4_ = uVar2;
                              auVar169._20_4_ = uVar2;
                              auVar169._24_4_ = uVar2;
                              auVar169._28_4_ = uVar2;
                              auVar172 = ZEXT3264(auVar169);
                              uVar20 = vptestmd_avx512vl(auVar169,*(undefined1 (*) [32])
                                                                   (ray + 0x120));
                              bVar73 = bVar73 & (byte)uVar20;
                              if (bVar73 == 0) goto LAB_007c71aa;
                              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                 (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                auVar86 = vrcp14ps_avx512vl(auVar85);
                                auVar180._8_4_ = 0x3f800000;
                                auVar180._0_8_ = 0x3f8000003f800000;
                                auVar180._12_4_ = 0x3f800000;
                                auVar180._16_4_ = 0x3f800000;
                                auVar180._20_4_ = 0x3f800000;
                                auVar180._24_4_ = 0x3f800000;
                                auVar180._28_4_ = 0x3f800000;
                                auVar84 = vfnmadd213ps_fma(auVar85,auVar86,auVar180);
                                auVar84 = vfmadd132ps_fma(ZEXT1632(auVar84),auVar86,auVar86);
                                auVar59._4_4_ = auVar84._4_4_ * fVar118;
                                auVar59._0_4_ = auVar84._0_4_ * fVar117;
                                auVar59._8_4_ = auVar84._8_4_ * fVar119;
                                auVar59._12_4_ = auVar84._12_4_ * fVar120;
                                auVar59._16_4_ = fVar121 * 0.0;
                                auVar59._20_4_ = fVar124 * 0.0;
                                auVar59._24_4_ = fVar125 * 0.0;
                                auVar59._28_4_ = auVar85._28_4_;
                                auVar85 = vminps_avx(auVar59,auVar180);
                                auVar60._4_4_ = auVar84._4_4_ * auVar158._4_4_;
                                auVar60._0_4_ = auVar84._0_4_ * auVar158._0_4_;
                                auVar60._8_4_ = auVar84._8_4_ * auVar158._8_4_;
                                auVar60._12_4_ = auVar84._12_4_ * auVar158._12_4_;
                                auVar60._16_4_ = fVar114 * 0.0;
                                auVar60._20_4_ = fVar113 * 0.0;
                                auVar60._24_4_ = fVar116 * 0.0;
                                auVar60._28_4_ = uVar187;
                                auVar86 = vminps_avx(auVar60,auVar180);
                                local_5b20 = vsubps_avx(auVar180,auVar85);
                                auVar138 = ZEXT3264(local_5b20);
                                local_5b00 = vsubps_avx(auVar180,auVar86);
                                auVar160 = ZEXT3264(local_5b00);
                                pRVar8 = context->user;
                                local_5ac0 = vpbroadcastd_avx512vl();
                                auVar172 = ZEXT3264(local_5ac0);
                                local_5ae0 = vpbroadcastd_avx512vl();
                                auVar182 = ZEXT3264(local_5ae0);
                                auVar85 = ZEXT1632(auVar83);
                                local_5b80[0] = (RTCHitN)auVar85[0];
                                local_5b80[1] = (RTCHitN)auVar85[1];
                                local_5b80[2] = (RTCHitN)auVar85[2];
                                local_5b80[3] = (RTCHitN)auVar85[3];
                                local_5b80[4] = (RTCHitN)auVar85[4];
                                local_5b80[5] = (RTCHitN)auVar85[5];
                                local_5b80[6] = (RTCHitN)auVar85[6];
                                local_5b80[7] = (RTCHitN)auVar85[7];
                                local_5b80[8] = (RTCHitN)auVar85[8];
                                local_5b80[9] = (RTCHitN)auVar85[9];
                                local_5b80[10] = (RTCHitN)auVar85[10];
                                local_5b80[0xb] = (RTCHitN)auVar85[0xb];
                                local_5b80[0xc] = (RTCHitN)auVar85[0xc];
                                local_5b80[0xd] = (RTCHitN)auVar85[0xd];
                                local_5b80[0xe] = (RTCHitN)auVar85[0xe];
                                local_5b80[0xf] = (RTCHitN)auVar85[0xf];
                                local_5b80[0x10] = (RTCHitN)auVar85[0x10];
                                local_5b80[0x11] = (RTCHitN)auVar85[0x11];
                                local_5b80[0x12] = (RTCHitN)auVar85[0x12];
                                local_5b80[0x13] = (RTCHitN)auVar85[0x13];
                                local_5b80[0x14] = (RTCHitN)auVar85[0x14];
                                local_5b80[0x15] = (RTCHitN)auVar85[0x15];
                                local_5b80[0x16] = (RTCHitN)auVar85[0x16];
                                local_5b80[0x17] = (RTCHitN)auVar85[0x17];
                                local_5b80[0x18] = (RTCHitN)auVar85[0x18];
                                local_5b80[0x19] = (RTCHitN)auVar85[0x19];
                                local_5b80[0x1a] = (RTCHitN)auVar85[0x1a];
                                local_5b80[0x1b] = (RTCHitN)auVar85[0x1b];
                                local_5b80[0x1c] = (RTCHitN)auVar85[0x1c];
                                local_5b80[0x1d] = (RTCHitN)auVar85[0x1d];
                                local_5b80[0x1e] = (RTCHitN)auVar85[0x1e];
                                local_5b80[0x1f] = (RTCHitN)auVar85[0x1f];
                                _local_5b60 = auVar109;
                                _local_5b40 = ZEXT1632(auVar122);
                                auVar85 = vpcmpeqd_avx2(auVar85,auVar85);
                                local_5cc8[1] = auVar85;
                                *local_5cc8 = auVar85;
                                local_5aa0 = pRVar8->instID[0];
                                uStack_5a9c = local_5aa0;
                                uStack_5a98 = local_5aa0;
                                uStack_5a94 = local_5aa0;
                                uStack_5a90 = local_5aa0;
                                uStack_5a8c = local_5aa0;
                                uStack_5a88 = local_5aa0;
                                uStack_5a84 = local_5aa0;
                                local_5a80 = pRVar8->instPrimID[0];
                                uStack_5a7c = local_5a80;
                                uStack_5a78 = local_5a80;
                                uStack_5a74 = local_5a80;
                                uStack_5a70 = local_5a80;
                                uStack_5a6c = local_5a80;
                                uStack_5a68 = local_5a80;
                                uStack_5a64 = local_5a80;
                                local_5c80._0_4_ = auVar179._0_4_;
                                local_5c80._4_4_ = auVar179._4_4_;
                                local_5c80._8_4_ = auVar179._8_4_;
                                local_5c80._12_4_ = auVar179._12_4_;
                                local_5c80._16_4_ = auVar179._16_4_;
                                local_5c80._20_4_ = auVar179._20_4_;
                                local_5c80._24_4_ = auVar179._24_4_;
                                auVar85 = vmulps_avx512vl(ZEXT1632(auVar84),auVar148);
                                bVar79 = (bool)(bVar73 >> 1 & 1);
                                bVar10 = (bool)(bVar73 >> 2 & 1);
                                bVar11 = (bool)(bVar73 >> 3 & 1);
                                bVar12 = (bool)(bVar73 >> 4 & 1);
                                bVar13 = (bool)(bVar73 >> 5 & 1);
                                bVar14 = (bool)(bVar73 >> 6 & 1);
                                *(uint *)(ray + 0x100) =
                                     (uint)(bVar73 & 1) * auVar85._0_4_ |
                                     (uint)!(bool)(bVar73 & 1) * local_5c80._0_4_;
                                *(uint *)(ray + 0x104) =
                                     (uint)bVar79 * auVar85._4_4_ | (uint)!bVar79 * local_5c80._4_4_
                                ;
                                *(uint *)(ray + 0x108) =
                                     (uint)bVar10 * auVar85._8_4_ | (uint)!bVar10 * local_5c80._8_4_
                                ;
                                *(uint *)(ray + 0x10c) =
                                     (uint)bVar11 * auVar85._12_4_ |
                                     (uint)!bVar11 * local_5c80._12_4_;
                                *(uint *)(ray + 0x110) =
                                     (uint)bVar12 * auVar85._16_4_ |
                                     (uint)!bVar12 * local_5c80._16_4_;
                                *(uint *)(ray + 0x114) =
                                     (uint)bVar13 * auVar85._20_4_ |
                                     (uint)!bVar13 * local_5c80._20_4_;
                                *(uint *)(ray + 0x118) =
                                     (uint)bVar14 * auVar85._24_4_ |
                                     (uint)!bVar14 * local_5c80._24_4_;
                                *(uint *)(ray + 0x11c) =
                                     (uint)(bVar73 >> 7) * auVar85._28_4_ |
                                     (uint)!(bool)(bVar73 >> 7) * iVar70;
                                local_5d60 = vpmovm2d_avx512vl((ulong)bVar73);
                                local_5d40._0_8_ = local_5d60;
                                local_5d40._8_8_ = pGVar5->userPtr;
                                local_5d40._16_8_ = context->user;
                                local_5d40._24_8_ = ray;
                                local_5d20._0_4_ = SUB84(local_5b80,0);
                                local_5d20._4_4_ = (float)((ulong)local_5b80 >> 0x20);
                                fStack_5d18 = 1.12104e-44;
                                local_5c80 = auVar89;
                                local_5d20 = local_5b80;
                                if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                  auVar138 = ZEXT1664(local_5b20._0_16_);
                                  auVar149 = ZEXT1664(auVar146);
                                  auVar160 = ZEXT1664(local_5b00._0_16_);
                                  auVar172 = ZEXT1664(local_5ac0._0_16_);
                                  auVar182 = ZEXT1664(local_5ae0._0_16_);
                                  auVar186 = ZEXT1664(auVar183);
                                  in_ZMM10 = ZEXT864(0) << 0x20;
                                  in_ZMM11 = ZEXT1664(auVar88._0_16_);
                                  in_ZMM12 = ZEXT1664(auVar184);
                                  in_ZMM13 = ZEXT1664(auVar157);
                                  in_ZMM14 = ZEXT1664(auVar100._0_16_);
                                  auVar198 = ZEXT1664(auVar97._0_16_);
                                  (*pGVar5->occlusionFilterN)
                                            ((RTCFilterFunctionNArguments *)local_5d40);
                                }
                                if (local_5d60 == (undefined1  [32])0x0) {
                                  uVar71 = 0;
                                }
                                else {
                                  p_Var9 = context->args->filter;
                                  if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                                     (((context->args->flags &
                                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                      ((*(byte *)(local_5cc0._0_8_ + 0x3e) & 0x40) != 0)))) {
                                    auVar138 = ZEXT1664(auVar138._0_16_);
                                    auVar149 = ZEXT1664(auVar149._0_16_);
                                    auVar160 = ZEXT1664(auVar160._0_16_);
                                    auVar172 = ZEXT1664(auVar172._0_16_);
                                    auVar182 = ZEXT1664(auVar182._0_16_);
                                    auVar186 = ZEXT1664(auVar186._0_16_);
                                    in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
                                    in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
                                    in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                                    in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                                    in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                                    auVar198 = ZEXT1664(auVar198._0_16_);
                                    (*p_Var9)((RTCFilterFunctionNArguments *)local_5d40);
                                  }
                                  uVar71 = vptestmd_avx512vl(local_5d60,local_5d60);
                                  auVar85 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                  bVar79 = (bool)((byte)uVar71 & 1);
                                  bVar10 = (bool)((byte)(uVar71 >> 1) & 1);
                                  bVar11 = (bool)((byte)(uVar71 >> 2) & 1);
                                  bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
                                  bVar13 = (bool)((byte)(uVar71 >> 4) & 1);
                                  bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
                                  bVar15 = (bool)((byte)(uVar71 >> 6) & 1);
                                  bVar16 = SUB81(uVar71 >> 7,0);
                                  *(uint *)(local_5d40._24_8_ + 0x100) =
                                       (uint)bVar79 * auVar85._0_4_ |
                                       (uint)!bVar79 * *(int *)(local_5d40._24_8_ + 0x100);
                                  *(uint *)(local_5d40._24_8_ + 0x104) =
                                       (uint)bVar10 * auVar85._4_4_ |
                                       (uint)!bVar10 * *(int *)(local_5d40._24_8_ + 0x104);
                                  *(uint *)(local_5d40._24_8_ + 0x108) =
                                       (uint)bVar11 * auVar85._8_4_ |
                                       (uint)!bVar11 * *(int *)(local_5d40._24_8_ + 0x108);
                                  *(uint *)(local_5d40._24_8_ + 0x10c) =
                                       (uint)bVar12 * auVar85._12_4_ |
                                       (uint)!bVar12 * *(int *)(local_5d40._24_8_ + 0x10c);
                                  *(uint *)(local_5d40._24_8_ + 0x110) =
                                       (uint)bVar13 * auVar85._16_4_ |
                                       (uint)!bVar13 * *(int *)(local_5d40._24_8_ + 0x110);
                                  *(uint *)(local_5d40._24_8_ + 0x114) =
                                       (uint)bVar14 * auVar85._20_4_ |
                                       (uint)!bVar14 * *(int *)(local_5d40._24_8_ + 0x114);
                                  *(uint *)(local_5d40._24_8_ + 0x118) =
                                       (uint)bVar15 * auVar85._24_4_ |
                                       (uint)!bVar15 * *(int *)(local_5d40._24_8_ + 0x118);
                                  *(uint *)(local_5d40._24_8_ + 0x11c) =
                                       (uint)bVar16 * auVar85._28_4_ |
                                       (uint)!bVar16 * *(int *)(local_5d40._24_8_ + 0x11c);
                                }
                                bVar73 = (byte)uVar71;
                                auVar112._0_4_ =
                                     (uint)(bVar73 & 1) * *(int *)local_5d70 |
                                     (uint)!(bool)(bVar73 & 1) * local_5c80._0_4_;
                                bVar79 = (bool)((byte)(uVar71 >> 1) & 1);
                                auVar112._4_4_ =
                                     (uint)bVar79 * *(int *)(local_5d70 + 4) |
                                     (uint)!bVar79 * local_5c80._4_4_;
                                bVar79 = (bool)((byte)(uVar71 >> 2) & 1);
                                auVar112._8_4_ =
                                     (uint)bVar79 * *(int *)(local_5d70 + 8) |
                                     (uint)!bVar79 * local_5c80._8_4_;
                                bVar79 = (bool)((byte)(uVar71 >> 3) & 1);
                                auVar112._12_4_ =
                                     (uint)bVar79 * *(int *)(local_5d70 + 0xc) |
                                     (uint)!bVar79 * local_5c80._12_4_;
                                bVar79 = (bool)((byte)(uVar71 >> 4) & 1);
                                auVar112._16_4_ =
                                     (uint)bVar79 * *(int *)(local_5d70 + 0x10) |
                                     (uint)!bVar79 * local_5c80._16_4_;
                                bVar79 = (bool)((byte)(uVar71 >> 5) & 1);
                                auVar112._20_4_ =
                                     (uint)bVar79 * *(int *)(local_5d70 + 0x14) |
                                     (uint)!bVar79 * local_5c80._20_4_;
                                bVar79 = (bool)((byte)(uVar71 >> 6) & 1);
                                auVar112._24_4_ =
                                     (uint)bVar79 * *(int *)(local_5d70 + 0x18) |
                                     (uint)!bVar79 * local_5c80._24_4_;
                                bVar79 = (bool)((byte)(uVar71 >> 7) & 1);
                                auVar112._28_4_ =
                                     (uint)bVar79 * *(int *)(local_5d70 + 0x1c) |
                                     (uint)!bVar79 * local_5c80._28_4_;
                                *(undefined1 (*) [32])local_5d70 = auVar112;
                              }
                              bVar76 = bVar76 & ~bVar73;
                              auVar88 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar85 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                              auVar89 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                              auVar86 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                              auVar82 = vxorps_avx512vl(auVar82,auVar82);
                              auVar87 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                            }
                            auVar205 = ZEXT3264(auVar87);
                            auVar204 = ZEXT1664(auVar82);
                            auVar203 = ZEXT3264(auVar86);
                            auVar202 = ZEXT3264(auVar89);
                            auVar201 = ZEXT3264(auVar85);
                            auVar200 = ZEXT3264(auVar88);
                          }
                        }
                      }
                      if ((bVar76 == 0) || (bVar79 = 2 < uVar72, uVar72 = uVar72 + 1, bVar79))
                      break;
                    }
                    bVar69 = bVar69 & bVar76;
                  } while ((bVar69 != 0) && (uVar72 = local_5c88 + 1, uVar72 < local_5c90));
                  bVar69 = ~bVar69;
                }
                auVar85 = auVar202._0_32_;
                local_5dbc = local_5dbc | bVar69;
                if (local_5dbc == 0xff) {
                  local_5dbc = 0xff;
                  goto LAB_007c7786;
                }
                auVar85 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                local_5840._0_4_ =
                     (uint)(local_5dbc & 1) * auVar85._0_4_ |
                     (uint)!(bool)(local_5dbc & 1) * local_5840._0_4_;
                bVar79 = (bool)(local_5dbc >> 1 & 1);
                local_5840._4_4_ = (uint)bVar79 * auVar85._4_4_ | (uint)!bVar79 * local_5840._4_4_;
                bVar79 = (bool)(local_5dbc >> 2 & 1);
                local_5840._8_4_ = (uint)bVar79 * auVar85._8_4_ | (uint)!bVar79 * local_5840._8_4_;
                bVar79 = (bool)(local_5dbc >> 3 & 1);
                local_5840._12_4_ =
                     (uint)bVar79 * auVar85._12_4_ | (uint)!bVar79 * local_5840._12_4_;
                bVar79 = (bool)(local_5dbc >> 4 & 1);
                local_5840._16_4_ =
                     (uint)bVar79 * auVar85._16_4_ | (uint)!bVar79 * local_5840._16_4_;
                bVar79 = (bool)(local_5dbc >> 5 & 1);
                local_5840._20_4_ =
                     (uint)bVar79 * auVar85._20_4_ | (uint)!bVar79 * local_5840._20_4_;
                bVar79 = (bool)(local_5dbc >> 6 & 1);
                local_5840._24_4_ =
                     (uint)bVar79 * auVar85._24_4_ | (uint)!bVar79 * local_5840._24_4_;
                local_5840._28_4_ =
                     (uint)(local_5dbc >> 7) * auVar85._28_4_ |
                     (uint)!(bool)(local_5dbc >> 7) * local_5840._28_4_;
              }
              goto LAB_007c6453;
            }
            uVar71 = root.ptr & 0xfffffffffffffff0;
            auVar85 = auVar203._0_32_;
            do {
              uVar77 = *(ulong *)(uVar71 + 0x40 + lVar74 * 2);
              if (uVar77 == 8) break;
              uVar187 = *(undefined4 *)(uVar71 + 0x120 + lVar74);
              auVar111._4_4_ = uVar187;
              auVar111._0_4_ = uVar187;
              auVar111._8_4_ = uVar187;
              auVar111._12_4_ = uVar187;
              auVar111._16_4_ = uVar187;
              auVar111._20_4_ = uVar187;
              auVar111._24_4_ = uVar187;
              auVar111._28_4_ = uVar187;
              auVar88 = *(undefined1 (*) [32])(ray + 0xe0);
              uVar187 = *(undefined4 *)(uVar71 + 0x60 + lVar74);
              auVar87._4_4_ = uVar187;
              auVar87._0_4_ = uVar187;
              auVar87._8_4_ = uVar187;
              auVar87._12_4_ = uVar187;
              auVar87._16_4_ = uVar187;
              auVar87._20_4_ = uVar187;
              auVar87._24_4_ = uVar187;
              auVar87._28_4_ = uVar187;
              auVar89 = vfmadd213ps_avx512vl(auVar111,auVar88,auVar87);
              uVar187 = *(undefined4 *)(uVar71 + 0x160 + lVar74);
              auVar100._4_4_ = uVar187;
              auVar100._0_4_ = uVar187;
              auVar100._8_4_ = uVar187;
              auVar100._12_4_ = uVar187;
              auVar100._16_4_ = uVar187;
              auVar100._20_4_ = uVar187;
              auVar100._24_4_ = uVar187;
              auVar100._28_4_ = uVar187;
              uVar187 = *(undefined4 *)(uVar71 + 0xa0 + lVar74);
              auVar90._4_4_ = uVar187;
              auVar90._0_4_ = uVar187;
              auVar90._8_4_ = uVar187;
              auVar90._12_4_ = uVar187;
              auVar90._16_4_ = uVar187;
              auVar90._20_4_ = uVar187;
              auVar90._24_4_ = uVar187;
              auVar90._28_4_ = uVar187;
              auVar86 = vfmadd213ps_avx512vl(auVar100,auVar88,auVar90);
              uVar187 = *(undefined4 *)(uVar71 + 0x1a0 + lVar74);
              auVar101._4_4_ = uVar187;
              auVar101._0_4_ = uVar187;
              auVar101._8_4_ = uVar187;
              auVar101._12_4_ = uVar187;
              auVar101._16_4_ = uVar187;
              auVar101._20_4_ = uVar187;
              auVar101._24_4_ = uVar187;
              auVar101._28_4_ = uVar187;
              uVar187 = *(undefined4 *)(uVar71 + 0xe0 + lVar74);
              auVar91._4_4_ = uVar187;
              auVar91._0_4_ = uVar187;
              auVar91._8_4_ = uVar187;
              auVar91._12_4_ = uVar187;
              auVar91._16_4_ = uVar187;
              auVar91._20_4_ = uVar187;
              auVar91._24_4_ = uVar187;
              auVar91._28_4_ = uVar187;
              auVar87 = vfmadd213ps_avx512vl(auVar101,auVar88,auVar91);
              uVar187 = *(undefined4 *)(uVar71 + 0x140 + lVar74);
              auVar102._4_4_ = uVar187;
              auVar102._0_4_ = uVar187;
              auVar102._8_4_ = uVar187;
              auVar102._12_4_ = uVar187;
              auVar102._16_4_ = uVar187;
              auVar102._20_4_ = uVar187;
              auVar102._24_4_ = uVar187;
              auVar102._28_4_ = uVar187;
              uVar187 = *(undefined4 *)(uVar71 + 0x80 + lVar74);
              auVar92._4_4_ = uVar187;
              auVar92._0_4_ = uVar187;
              auVar92._8_4_ = uVar187;
              auVar92._12_4_ = uVar187;
              auVar92._16_4_ = uVar187;
              auVar92._20_4_ = uVar187;
              auVar92._24_4_ = uVar187;
              auVar92._28_4_ = uVar187;
              auVar90 = vfmadd213ps_avx512vl(auVar102,auVar88,auVar92);
              uVar187 = *(undefined4 *)(uVar71 + 0x180 + lVar74);
              auVar103._4_4_ = uVar187;
              auVar103._0_4_ = uVar187;
              auVar103._8_4_ = uVar187;
              auVar103._12_4_ = uVar187;
              auVar103._16_4_ = uVar187;
              auVar103._20_4_ = uVar187;
              auVar103._24_4_ = uVar187;
              auVar103._28_4_ = uVar187;
              uVar187 = *(undefined4 *)(uVar71 + 0xc0 + lVar74);
              auVar97._4_4_ = uVar187;
              auVar97._0_4_ = uVar187;
              auVar97._8_4_ = uVar187;
              auVar97._12_4_ = uVar187;
              auVar97._16_4_ = uVar187;
              auVar97._20_4_ = uVar187;
              auVar97._24_4_ = uVar187;
              auVar97._28_4_ = uVar187;
              auVar91 = vfmadd213ps_avx512vl(auVar103,auVar88,auVar97);
              uVar187 = *(undefined4 *)(uVar71 + 0x1c0 + lVar74);
              auVar104._4_4_ = uVar187;
              auVar104._0_4_ = uVar187;
              auVar104._8_4_ = uVar187;
              auVar104._12_4_ = uVar187;
              auVar104._16_4_ = uVar187;
              auVar104._20_4_ = uVar187;
              auVar104._24_4_ = uVar187;
              auVar104._28_4_ = uVar187;
              uVar187 = *(undefined4 *)(uVar71 + 0x100 + lVar74);
              auVar98._4_4_ = uVar187;
              auVar98._0_4_ = uVar187;
              auVar98._8_4_ = uVar187;
              auVar98._12_4_ = uVar187;
              auVar98._16_4_ = uVar187;
              auVar98._20_4_ = uVar187;
              auVar98._24_4_ = uVar187;
              auVar98._28_4_ = uVar187;
              auVar92 = vfmadd213ps_avx512vl(auVar104,auVar88,auVar98);
              in_ZMM11 = ZEXT3264(local_5940);
              auVar109._4_4_ = fStack_591c;
              auVar109._0_4_ = local_5920;
              auVar109._8_4_ = fStack_5918;
              auVar109._12_4_ = fStack_5914;
              auVar109._16_4_ = fStack_5910;
              auVar109._20_4_ = fStack_590c;
              auVar109._24_4_ = fStack_5908;
              auVar109._28_4_ = uStack_5904;
              in_ZMM12 = ZEXT3264(auVar109);
              auVar82 = vfmsub213ps_fma(auVar89,local_5980,auVar109);
              auVar110._4_4_ = fStack_58fc;
              auVar110._0_4_ = local_5900;
              auVar110._8_4_ = fStack_58f8;
              auVar110._12_4_ = fStack_58f4;
              auVar110._16_4_ = fStack_58f0;
              auVar110._20_4_ = fStack_58ec;
              auVar110._24_4_ = fStack_58e8;
              auVar110._28_4_ = uStack_58e4;
              in_ZMM13 = ZEXT3264(auVar110);
              auVar84 = vfmsub213ps_fma(auVar86,local_5960,auVar110);
              in_ZMM14 = ZEXT3264(local_58e0);
              auVar83 = vfmsub213ps_fma(auVar87,local_5940,local_58e0);
              auVar160 = ZEXT1664(auVar83);
              auVar122 = vfmsub213ps_fma(auVar90,local_5980,auVar109);
              auVar172 = ZEXT1664(auVar122);
              auVar184 = vfmsub213ps_fma(auVar91,local_5960,auVar110);
              auVar182 = ZEXT1664(auVar184);
              auVar157 = vfmsub213ps_fma(auVar92,local_5940,local_58e0);
              auVar186 = ZEXT1664(auVar157);
              auVar89 = vpminsd_avx2(ZEXT1632(auVar82),ZEXT1632(auVar122));
              auVar86 = vpminsd_avx2(ZEXT1632(auVar84),ZEXT1632(auVar184));
              auVar89 = vpmaxsd_avx2(auVar89,auVar86);
              auVar86 = vpminsd_avx2(ZEXT1632(auVar83),ZEXT1632(auVar157));
              in_ZMM10 = ZEXT3264(auVar86);
              auVar89 = vpmaxsd_avx2(auVar89,auVar86);
              auVar86 = vpmaxsd_avx2(ZEXT1632(auVar82),ZEXT1632(auVar122));
              auVar87 = vpmaxsd_avx2(ZEXT1632(auVar84),ZEXT1632(auVar184));
              auVar87 = vpminsd_avx2(auVar86,auVar87);
              auVar86 = vpmaxsd_avx2(ZEXT1632(auVar83),ZEXT1632(auVar157));
              auVar87 = vpminsd_avx2(auVar87,auVar86);
              auVar86 = vpmaxsd_avx2(auVar89,local_5860);
              auVar138 = ZEXT3264(auVar86);
              auVar87 = vpminsd_avx2(auVar87,local_5840);
              auVar149 = ZEXT3264(auVar87);
              uVar81 = vcmpps_avx512vl(auVar86,auVar87,2);
              if (((uint)root.ptr & 7) == 6) {
                uVar187 = *(undefined4 *)(uVar71 + 0x1e0 + lVar74);
                auVar105._4_4_ = uVar187;
                auVar105._0_4_ = uVar187;
                auVar105._8_4_ = uVar187;
                auVar105._12_4_ = uVar187;
                auVar105._16_4_ = uVar187;
                auVar105._20_4_ = uVar187;
                auVar105._24_4_ = uVar187;
                auVar105._28_4_ = uVar187;
                uVar18 = vcmpps_avx512vl(auVar88,auVar105,0xd);
                uVar187 = *(undefined4 *)(uVar71 + 0x200 + lVar74);
                auVar106._4_4_ = uVar187;
                auVar106._0_4_ = uVar187;
                auVar106._8_4_ = uVar187;
                auVar106._12_4_ = uVar187;
                auVar106._16_4_ = uVar187;
                auVar106._20_4_ = uVar187;
                auVar106._24_4_ = uVar187;
                auVar106._28_4_ = uVar187;
                uVar19 = vcmpps_avx512vl(auVar88,auVar106,1);
                uVar81 = uVar81 & uVar18 & uVar19;
              }
              uVar18 = vcmpps_avx512vl(local_5840,auVar198._0_32_,6);
              uVar81 = uVar81 & uVar18;
              uVar18 = uVar72;
              auVar107 = auVar85;
              if ((byte)uVar81 != 0) {
                auVar89 = vblendmps_avx512vl(auVar203._0_32_,auVar89);
                bVar79 = (bool)((byte)uVar81 & 1);
                auVar107._0_4_ = (uint)bVar79 * auVar89._0_4_ | (uint)!bVar79 * auVar88._0_4_;
                bVar79 = (bool)((byte)(uVar81 >> 1) & 1);
                auVar107._4_4_ = (uint)bVar79 * auVar89._4_4_ | (uint)!bVar79 * auVar88._4_4_;
                bVar79 = (bool)((byte)(uVar81 >> 2) & 1);
                auVar107._8_4_ = (uint)bVar79 * auVar89._8_4_ | (uint)!bVar79 * auVar88._8_4_;
                bVar79 = (bool)((byte)(uVar81 >> 3) & 1);
                auVar107._12_4_ = (uint)bVar79 * auVar89._12_4_ | (uint)!bVar79 * auVar88._12_4_;
                bVar79 = (bool)((byte)(uVar81 >> 4) & 1);
                auVar107._16_4_ = (uint)bVar79 * auVar89._16_4_ | (uint)!bVar79 * auVar88._16_4_;
                bVar79 = (bool)((byte)(uVar81 >> 5) & 1);
                auVar107._20_4_ = (uint)bVar79 * auVar89._20_4_ | (uint)!bVar79 * auVar88._20_4_;
                bVar79 = (bool)((byte)(uVar81 >> 6) & 1);
                auVar107._24_4_ = (uint)bVar79 * auVar89._24_4_ | (uint)!bVar79 * auVar88._24_4_;
                bVar79 = SUB81(uVar81 >> 7,0);
                auVar107._28_4_ = (uint)bVar79 * auVar89._28_4_ | (uint)!bVar79 * auVar88._28_4_;
                uVar18 = uVar77;
                if (uVar72 != 8) {
                  *puVar78 = uVar72;
                  puVar78 = puVar78 + 1;
                  *pauVar75 = auVar85;
                  pauVar75 = pauVar75 + 1;
                }
              }
              auVar85 = auVar107;
              uVar72 = uVar18;
              lVar74 = lVar74 + 4;
            } while (lVar74 != 0);
            if (uVar72 == 8) goto LAB_007c6690;
            uVar20 = vcmpps_avx512vl(auVar85,local_5840,9);
            auVar198 = ZEXT3264(auVar85);
            root.ptr = uVar72;
          } while ((byte)uVar80 < (byte)POPCOUNT((int)uVar20));
          *puVar78 = uVar72;
          puVar78 = puVar78 + 1;
          *pauVar75 = auVar85;
          pauVar75 = pauVar75 + 1;
LAB_007c6690:
          iVar70 = 4;
        }
        else {
          local_5c80._0_8_ = uVar71;
          do {
            k = 0;
            for (uVar71 = uVar72; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
              k = k + 1;
            }
            auVar138 = ZEXT1664(auVar138._0_16_);
            auVar149 = ZEXT1664(auVar149._0_16_);
            auVar160 = ZEXT1664(auVar160._0_16_);
            auVar172 = ZEXT1664(auVar172._0_16_);
            auVar182 = ZEXT1664(auVar182._0_16_);
            auVar186 = ZEXT1664(auVar186._0_16_);
            in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
            in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
            in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
            in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
            in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
            bVar79 = occluded1(local_5c98,local_5ca0,root,k,&local_5d81,ray,
                               (TravRayK<8,_false> *)&local_5a40.field_0,context);
            bVar69 = (byte)(1 << ((uint)k & 0x1f));
            if (!bVar79) {
              bVar69 = 0;
            }
            local_5dbc = local_5dbc | bVar69;
            uVar72 = uVar72 - 1 & uVar72;
          } while (uVar72 != 0);
          iVar70 = 3;
          if (local_5dbc != 0xff) {
            auVar85 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            local_5840._0_4_ =
                 (uint)(local_5dbc & 1) * auVar85._0_4_ |
                 (uint)!(bool)(local_5dbc & 1) * local_5840._0_4_;
            bVar79 = (bool)(local_5dbc >> 1 & 1);
            local_5840._4_4_ = (uint)bVar79 * auVar85._4_4_ | (uint)!bVar79 * local_5840._4_4_;
            bVar79 = (bool)(local_5dbc >> 2 & 1);
            local_5840._8_4_ = (uint)bVar79 * auVar85._8_4_ | (uint)!bVar79 * local_5840._8_4_;
            bVar79 = (bool)(local_5dbc >> 3 & 1);
            local_5840._12_4_ = (uint)bVar79 * auVar85._12_4_ | (uint)!bVar79 * local_5840._12_4_;
            bVar79 = (bool)(local_5dbc >> 4 & 1);
            local_5840._16_4_ = (uint)bVar79 * auVar85._16_4_ | (uint)!bVar79 * local_5840._16_4_;
            bVar79 = (bool)(local_5dbc >> 5 & 1);
            local_5840._20_4_ = (uint)bVar79 * auVar85._20_4_ | (uint)!bVar79 * local_5840._20_4_;
            bVar79 = (bool)(local_5dbc >> 6 & 1);
            local_5840._24_4_ = (uint)bVar79 * auVar85._24_4_ | (uint)!bVar79 * local_5840._24_4_;
            local_5840._28_4_ =
                 (uint)(local_5dbc >> 7) * auVar85._28_4_ |
                 (uint)!(bool)(local_5dbc >> 7) * local_5840._28_4_;
            iVar70 = 2;
          }
          auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar200 = ZEXT3264(auVar85);
          auVar85 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar201 = ZEXT3264(auVar85);
          auVar85 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
          auVar202 = ZEXT3264(auVar85);
          auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar203 = ZEXT3264(auVar85);
          auVar82 = vxorps_avx512vl(auVar204._0_16_,auVar204._0_16_);
          auVar204 = ZEXT1664(auVar82);
          auVar85 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar205 = ZEXT3264(auVar85);
          auVar198 = ZEXT3264(local_5cc0);
          if ((uint)uVar80 < (uint)local_5c80._0_4_) goto LAB_007c64a2;
        }
        auVar85 = auVar202._0_32_;
        if (iVar70 == 3) {
LAB_007c7786:
          local_5dbc = local_5dbc & (byte)local_5d64;
          bVar79 = (bool)(local_5dbc >> 1 & 1);
          bVar10 = (bool)(local_5dbc >> 2 & 1);
          bVar11 = (bool)(local_5dbc >> 3 & 1);
          bVar12 = (bool)(local_5dbc >> 4 & 1);
          bVar13 = (bool)(local_5dbc >> 5 & 1);
          bVar14 = (bool)(local_5dbc >> 6 & 1);
          *(uint *)local_5d70 =
               (uint)(local_5dbc & 1) * auVar85._0_4_ |
               (uint)!(bool)(local_5dbc & 1) * *(int *)local_5d70;
          *(uint *)(local_5d70 + 4) =
               (uint)bVar79 * auVar85._4_4_ | (uint)!bVar79 * *(int *)(local_5d70 + 4);
          *(uint *)(local_5d70 + 8) =
               (uint)bVar10 * auVar85._8_4_ | (uint)!bVar10 * *(int *)(local_5d70 + 8);
          *(uint *)(local_5d70 + 0xc) =
               (uint)bVar11 * auVar85._12_4_ | (uint)!bVar11 * *(int *)(local_5d70 + 0xc);
          *(uint *)(local_5d70 + 0x10) =
               (uint)bVar12 * auVar85._16_4_ | (uint)!bVar12 * *(int *)(local_5d70 + 0x10);
          *(uint *)(local_5d70 + 0x14) =
               (uint)bVar13 * auVar85._20_4_ | (uint)!bVar13 * *(int *)(local_5d70 + 0x14);
          *(uint *)(local_5d70 + 0x18) =
               (uint)bVar14 * auVar85._24_4_ | (uint)!bVar14 * *(int *)(local_5d70 + 0x18);
          *(uint *)(local_5d70 + 0x1c) =
               (uint)(local_5dbc >> 7) * auVar85._28_4_ |
               (uint)!(bool)(local_5dbc >> 7) * *(int *)(local_5d70 + 0x1c);
          return;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }